

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O1

void secp256k1_scalar_mul(secp256k1_scalar *r,secp256k1_scalar *a,secp256k1_scalar *b)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  bool bVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined8 uVar63;
  int iVar64;
  ulong uVar65;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  ulong uVar69;
  secp256k1_gej *psVar70;
  int64_t iVar71;
  int64_t iVar72;
  ulong uVar73;
  secp256k1_modinv64_signed62 *psVar74;
  byte bVar75;
  uint uVar76;
  secp256k1_gej *psVar77;
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  ulong uVar82;
  ulong *extraout_RDX;
  long lVar83;
  long lVar84;
  long lVar85;
  secp256k1_modinv64_signed62 *a_00;
  long *extraout_RDX_00;
  secp256k1_modinv64_signed62 *b_00;
  int iVar86;
  uint64_t *pb;
  secp256k1_gej *psVar87;
  secp256k1_gej *psVar88;
  long lVar89;
  secp256k1_gej *psVar90;
  secp256k1_gej *psVar91;
  secp256k1_gej *psVar92;
  secp256k1_modinv64_signed62 *psVar93;
  secp256k1_modinv64_signed62 *psVar94;
  uint uVar95;
  uint uVar96;
  secp256k1_gej *a_02;
  secp256k1_gej *psVar97;
  secp256k1_modinv64_signed62 *a_03;
  ulong uVar98;
  ulong uVar99;
  ulong uVar100;
  ulong uVar101;
  secp256k1_gej *psVar102;
  ulong uVar103;
  ulong uVar104;
  ulong uVar105;
  ulong uVar106;
  ulong uVar107;
  ulong uVar108;
  ulong uVar109;
  ulong uVar110;
  secp256k1_gej *psVar111;
  uint64_t *puVar112;
  long lVar113;
  undefined1 *puVar114;
  secp256k1_gej *psVar115;
  long lVar116;
  secp256k1_gej *psVar117;
  long lVar118;
  long lVar119;
  secp256k1_gej *psVar120;
  bool bVar121;
  uint64_t c;
  uint64_t p4;
  uint64_t p3;
  uint64_t p2;
  uint64_t p1;
  uint64_t p0;
  uint64_t m6;
  uint64_t m5;
  uint64_t m4;
  uint64_t m3;
  uint64_t m2;
  uint64_t m1;
  uint64_t m0;
  uint64_t l [8];
  secp256k1_modinv64_signed62 sStack_410;
  secp256k1_modinv64_signed62 sStack_3e8;
  secp256k1_gej *psStack_3c0;
  secp256k1_gej *psStack_3b8;
  secp256k1_gej *psStack_3b0;
  ulong uStack_3a8;
  secp256k1_gej *psStack_3a0;
  ulong uStack_398;
  secp256k1_gej *psStack_390;
  secp256k1_gej *psStack_388;
  long lStack_380;
  secp256k1_gej *psStack_378;
  secp256k1_gej *psStack_370;
  secp256k1_gej *psStack_368;
  uint64_t uStack_360;
  secp256k1_gej *psStack_358;
  secp256k1_gej *psStack_350;
  secp256k1_gej *psStack_348;
  secp256k1_gej *psStack_340;
  uint64_t uStack_338;
  secp256k1_gej *psStack_330;
  secp256k1_gej *psStack_328;
  secp256k1_gej *psStack_320;
  secp256k1_gej *psStack_318;
  secp256k1_gej *psStack_310;
  secp256k1_gej *psStack_308;
  long lStack_300;
  secp256k1_gej *psStack_2f8;
  code *pcStack_2f0;
  uint uStack_2e4;
  secp256k1_gej *psStack_2e0;
  secp256k1_gej *apsStack_2d8 [2];
  undefined1 auStack_2c8 [56];
  uint64_t uStack_290;
  uint64_t uStack_288;
  uint64_t uStack_280;
  uint64_t uStack_278;
  secp256k1_modinv64_trans2x2 sStack_268;
  undefined1 auStack_248 [96];
  ulong uStack_1e8;
  ulong uStack_1e0;
  secp256k1_gej *psStack_1d8;
  ulong uStack_1d0;
  secp256k1_scalar *psStack_1c8;
  secp256k1_gej *psStack_1b8;
  secp256k1_gej *psStack_1b0;
  secp256k1_gej *psStack_1a0;
  secp256k1_fe *psStack_198;
  secp256k1_fe sStack_190;
  ulong uStack_160;
  ulong uStack_158;
  code *pcStack_150;
  ulong local_140;
  ulong local_138;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  undefined1 local_48 [16];
  secp256k1_fe *a_01;
  
  pcStack_150 = (code *)0x14223e;
  secp256k1_scalar_verify(a);
  pcStack_150 = (code *)0x142246;
  secp256k1_scalar_verify(b);
  uVar66 = a->d[0];
  uVar73 = a->d[1];
  uVar69 = a->d[2];
  uVar67 = b->d[0];
  uVar68 = b->d[1];
  uVar110 = b->d[2];
  uVar105 = b->d[3];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar66;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar67;
  uVar78 = SUB168(auVar5 * auVar21,8);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = uVar78;
  local_78 = SUB168(auVar5 * auVar21,0);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar66;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar68;
  auVar6 = auVar6 * auVar22;
  uVar98 = SUB168(auVar6 + auVar60,0);
  uVar103 = SUB168(auVar6 + auVar60,8);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar73;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar67;
  uVar79 = SUB168(auVar7 * auVar23,8);
  uVar65 = SUB168(auVar7 * auVar23,0);
  local_70 = uVar98 + uVar65;
  uVar65 = (ulong)CARRY8(uVar98,uVar65);
  uVar98 = uVar103 + uVar79;
  uVar104 = uVar98 + uVar65;
  uVar106 = (ulong)CARRY8(auVar6._8_8_,(ulong)CARRY8(uVar78,auVar6._0_8_)) +
            (ulong)(CARRY8(uVar103,uVar79) || CARRY8(uVar98,uVar65));
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar66;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar110;
  uVar80 = SUB168(auVar8 * auVar24,8);
  uVar65 = SUB168(auVar8 * auVar24,0);
  uVar78 = uVar104 + uVar65;
  uVar65 = (ulong)CARRY8(uVar104,uVar65);
  uVar79 = uVar106 + uVar80;
  uVar107 = uVar79 + uVar65;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar73;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar68;
  uVar81 = SUB168(auVar9 * auVar25,8);
  uVar98 = SUB168(auVar9 * auVar25,0);
  uVar104 = uVar78 + uVar98;
  uVar98 = (ulong)CARRY8(uVar78,uVar98);
  uVar103 = uVar107 + uVar81;
  uVar108 = uVar103 + uVar98;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar69;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar67;
  uVar82 = SUB168(auVar10 * auVar26,8);
  uVar78 = SUB168(auVar10 * auVar26,0);
  local_68 = uVar104 + uVar78;
  uVar78 = (ulong)CARRY8(uVar104,uVar78);
  uVar104 = uVar108 + uVar82;
  uVar109 = uVar104 + uVar78;
  uVar108 = (ulong)(CARRY8(uVar106,uVar80) || CARRY8(uVar79,uVar65)) +
            (ulong)(CARRY8(uVar107,uVar81) || CARRY8(uVar103,uVar98)) +
            (ulong)(CARRY8(uVar108,uVar82) || CARRY8(uVar104,uVar78));
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar66;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar105;
  uVar81 = SUB168(auVar11 * auVar27,8);
  uVar66 = SUB168(auVar11 * auVar27,0);
  uVar78 = uVar109 + uVar66;
  uVar65 = (ulong)CARRY8(uVar109,uVar66);
  uVar79 = uVar108 + uVar81;
  uVar109 = uVar79 + uVar65;
  uVar66 = a->d[3];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar73;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar110;
  uVar82 = SUB168(auVar12 * auVar28,8);
  uVar98 = SUB168(auVar12 * auVar28,0);
  uVar104 = uVar78 + uVar98;
  uVar98 = (ulong)CARRY8(uVar78,uVar98);
  uVar103 = uVar109 + uVar82;
  uVar99 = uVar103 + uVar98;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar69;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar68;
  uVar106 = SUB168(auVar13 * auVar29,8);
  uVar78 = SUB168(auVar13 * auVar29,0);
  uVar80 = uVar104 + uVar78;
  uVar78 = (ulong)CARRY8(uVar104,uVar78);
  uVar104 = uVar99 + uVar106;
  uVar100 = uVar104 + uVar78;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar66;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar67;
  uVar107 = SUB168(auVar14 * auVar30,8);
  uVar67 = SUB168(auVar14 * auVar30,0);
  local_60 = uVar80 + uVar67;
  uVar67 = (ulong)CARRY8(uVar80,uVar67);
  uVar80 = uVar100 + uVar107;
  uVar101 = uVar80 + uVar67;
  uVar81 = (ulong)(CARRY8(uVar108,uVar81) || CARRY8(uVar79,uVar65)) +
           (ulong)(CARRY8(uVar109,uVar82) || CARRY8(uVar103,uVar98)) +
           (ulong)(CARRY8(uVar99,uVar106) || CARRY8(uVar104,uVar78)) +
           (ulong)(CARRY8(uVar100,uVar107) || CARRY8(uVar80,uVar67));
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar73;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar105;
  uVar103 = SUB168(auVar15 * auVar31,8);
  uVar67 = SUB168(auVar15 * auVar31,0);
  uVar78 = uVar101 + uVar67;
  uVar67 = (ulong)CARRY8(uVar101,uVar67);
  uVar98 = uVar81 + uVar103;
  uVar82 = uVar98 + uVar67;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar69;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar110;
  uVar104 = SUB168(auVar16 * auVar32,8);
  uVar65 = SUB168(auVar16 * auVar32,0);
  uVar79 = uVar78 + uVar65;
  uVar65 = (ulong)CARRY8(uVar78,uVar65);
  uVar78 = uVar82 + uVar104;
  uVar106 = uVar78 + uVar65;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar66;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar68;
  uVar80 = SUB168(auVar17 * auVar33,8);
  uVar68 = SUB168(auVar17 * auVar33,0);
  local_58 = uVar79 + uVar68;
  uVar68 = (ulong)CARRY8(uVar79,uVar68);
  uVar79 = uVar106 + uVar80;
  uVar107 = uVar79 + uVar68;
  uVar79 = (ulong)(CARRY8(uVar81,uVar103) || CARRY8(uVar98,uVar67)) +
           (ulong)(CARRY8(uVar82,uVar104) || CARRY8(uVar78,uVar65)) +
           (ulong)(CARRY8(uVar106,uVar80) || CARRY8(uVar79,uVar68));
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar69;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar105;
  uVar65 = SUB168(auVar18 * auVar34,8);
  uVar69 = SUB168(auVar18 * auVar34,0);
  uVar78 = uVar107 + uVar69;
  uVar69 = (ulong)CARRY8(uVar107,uVar69);
  uVar68 = uVar79 + uVar65;
  uVar103 = uVar68 + uVar69;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar66;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar110;
  uVar98 = SUB168(auVar19 * auVar35,8);
  uVar67 = SUB168(auVar19 * auVar35,0);
  local_50 = uVar78 + uVar67;
  uVar67 = (ulong)CARRY8(uVar78,uVar67);
  uVar110 = uVar103 + uVar98;
  auVar53._8_8_ =
       (ulong)(CARRY8(uVar79,uVar65) || CARRY8(uVar68,uVar69)) +
       (ulong)(CARRY8(uVar103,uVar98) || CARRY8(uVar110,uVar67));
  auVar53._0_8_ = uVar110 + uVar67;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar66;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar105;
  local_48 = auVar20 * auVar36 + auVar53;
  uVar63 = local_48._8_8_;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = local_78;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = local_58;
  auVar54 = ZEXT816(0x402da1732fc9bebf) * auVar37 + auVar54;
  local_e8 = auVar54._0_8_;
  uVar69 = auVar54._8_8_;
  uVar68 = uVar69 + local_70;
  uVar69 = (ulong)CARRY8(uVar69,local_70);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = local_50;
  uVar65 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar38,8);
  uVar67 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar38,0);
  uVar105 = uVar68 + uVar67;
  uVar67 = (ulong)CARRY8(uVar68,uVar67);
  uVar110 = uVar69 + uVar65;
  uVar78 = uVar110 + uVar67;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = local_58;
  uVar98 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar39,8);
  uVar68 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar39,0);
  local_f0 = uVar105 + uVar68;
  uVar68 = (ulong)CARRY8(uVar105,uVar68);
  uVar105 = uVar78 + uVar98;
  uVar103 = uVar105 + uVar68;
  uVar79 = (ulong)(CARRY8(uVar69,uVar65) || CARRY8(uVar110,uVar67)) +
           (ulong)(CARRY8(uVar78,uVar98) || CARRY8(uVar105,uVar68));
  uVar68 = uVar103 + local_68;
  uVar69 = (ulong)CARRY8(uVar103,local_68);
  uVar103 = uVar79 + uVar69;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = local_48._0_8_;
  uVar98 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar40,8);
  uVar67 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar40,0);
  uVar110 = uVar68 + uVar67;
  uVar67 = (ulong)CARRY8(uVar68,uVar67);
  uVar105 = uVar103 + uVar98;
  uVar104 = uVar105 + uVar67;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = local_50;
  uVar78 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar41,8);
  uVar68 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar41,0);
  uVar81 = uVar110 + uVar68;
  uVar68 = (ulong)CARRY8(uVar110,uVar68);
  uVar65 = uVar104 + uVar78;
  uVar80 = uVar65 + uVar68;
  local_f8 = uVar81 + local_58;
  uVar110 = (ulong)CARRY8(uVar81,local_58);
  uVar81 = uVar80 + uVar110;
  uVar103 = (ulong)CARRY8(uVar79,uVar69) + (ulong)(CARRY8(uVar103,uVar98) || CARRY8(uVar105,uVar67))
            + (ulong)(CARRY8(uVar104,uVar78) || CARRY8(uVar65,uVar68)) +
            (ulong)CARRY8(uVar80,uVar110);
  uVar68 = uVar81 + local_60;
  uVar69 = (ulong)CARRY8(uVar81,local_60);
  uVar104 = uVar103 + uVar69;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = local_48._8_8_;
  uVar98 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar42,8);
  uVar67 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar42,0);
  uVar110 = uVar68 + uVar67;
  uVar67 = (ulong)CARRY8(uVar68,uVar67);
  uVar105 = uVar104 + uVar98;
  uVar80 = uVar105 + uVar67;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = local_48._0_8_;
  uVar78 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar43,8);
  uVar68 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar43,0);
  uVar79 = uVar110 + uVar68;
  uVar68 = (ulong)CARRY8(uVar110,uVar68);
  uVar65 = uVar80 + uVar78;
  uVar81 = uVar65 + uVar68;
  local_100 = uVar79 + local_50;
  uVar110 = (ulong)CARRY8(uVar79,local_50);
  uVar79 = uVar81 + uVar110;
  uVar105 = (ulong)CARRY8(uVar103,uVar69) +
            (ulong)(CARRY8(uVar104,uVar98) || CARRY8(uVar105,uVar67)) +
            (ulong)(CARRY8(uVar80,uVar78) || CARRY8(uVar65,uVar68)) + (ulong)CARRY8(uVar81,uVar110);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = local_48._8_8_;
  uVar110 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar44,8);
  uVar69 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar44,0);
  uVar67 = uVar79 + uVar69;
  uVar69 = (ulong)CARRY8(uVar79,uVar69);
  uVar68 = uVar105 + uVar110;
  uVar65 = uVar68 + uVar69;
  auVar61._8_8_ = uVar65;
  auVar61._0_8_ = uVar67;
  local_108 = SUB168(local_48 + auVar61,0);
  uVar67 = (ulong)CARRY8(uVar67,local_48._0_8_);
  uVar106 = SUB168(local_48 + auVar61,8);
  uVar79 = (ulong)(CARRY8(uVar105,uVar110) || CARRY8(uVar68,uVar69)) + (ulong)CARRY8(uVar65,uVar67)
           + (ulong)CARRY8(uVar65 + uVar67,local_48._8_8_);
  auVar59._8_8_ = uVar79;
  auVar59._0_8_ = uVar106;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = local_e8;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = local_108;
  auVar55 = ZEXT816(0x402da1732fc9bebf) * auVar45 + auVar55;
  local_120 = auVar55._0_8_;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = local_120;
  uVar69 = auVar55._8_8_;
  uVar68 = uVar69 + local_f0;
  uVar69 = (ulong)CARRY8(uVar69,local_f0);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar106;
  uVar65 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar46,8);
  uVar67 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar46,0);
  uVar105 = uVar68 + uVar67;
  uVar67 = (ulong)CARRY8(uVar68,uVar67);
  uVar110 = uVar69 + uVar65;
  uVar78 = uVar110 + uVar67;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = local_108;
  uVar98 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar47,8);
  uVar68 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar47,0);
  local_128 = uVar105 + uVar68;
  uVar68 = (ulong)CARRY8(uVar105,uVar68);
  uVar105 = uVar78 + uVar98;
  uVar104 = uVar105 + uVar68;
  uVar103 = (ulong)(CARRY8(uVar69,uVar65) || CARRY8(uVar110,uVar67)) +
            (ulong)(CARRY8(uVar78,uVar98) || CARRY8(uVar105,uVar68));
  uVar68 = uVar104 + local_f8;
  uVar69 = (ulong)CARRY8(uVar104,local_f8);
  uVar104 = uVar103 + uVar69;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar79;
  uVar98 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar48,8);
  uVar67 = SUB168(ZEXT816(0x402da1732fc9bebf) * auVar48,0);
  uVar110 = uVar68 + uVar67;
  uVar67 = (ulong)CARRY8(uVar68,uVar67);
  uVar105 = uVar104 + uVar98;
  uVar80 = uVar105 + uVar67;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = uVar106;
  uVar78 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar49,8);
  uVar68 = SUB168(ZEXT816(0x4551231950b75fc4) * auVar49,0);
  uVar82 = uVar110 + uVar68;
  uVar68 = (ulong)CARRY8(uVar110,uVar68);
  uVar65 = uVar80 + uVar78;
  uVar81 = uVar65 + uVar68;
  local_130 = uVar82 + local_108;
  uVar110 = (ulong)CARRY8(uVar82,local_108);
  uVar82 = uVar81 + uVar110;
  auVar56._8_8_ =
       (ulong)CARRY8(uVar103,uVar69) + (ulong)(CARRY8(uVar104,uVar98) || CARRY8(uVar105,uVar67)) +
       (ulong)(CARRY8(uVar80,uVar78) || CARRY8(uVar65,uVar68)) + (ulong)CARRY8(uVar81,uVar110) +
       (ulong)CARRY8(uVar82,local_100);
  auVar56._0_8_ = uVar82 + local_100;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar79;
  auVar59 = ZEXT816(0x4551231950b75fc4) * auVar50 + auVar56 + auVar59;
  local_138 = auVar59._0_8_;
  local_140 = auVar59._8_8_;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = local_140;
  auVar62 = ZEXT816(0x402da1732fc9bebf) * auVar51 + auVar62;
  uVar69 = auVar62._8_8_;
  r->d[0] = auVar62._0_8_;
  auVar57[8] = CARRY8(uVar69,local_128);
  auVar57._0_8_ = uVar69 + local_128;
  auVar57._9_7_ = 0;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = local_140;
  auVar57 = ZEXT816(0x4551231950b75fc4) * auVar52 + auVar57;
  uVar69 = auVar57._8_8_;
  r->d[1] = auVar57._0_8_;
  uVar67 = uVar69 + local_140;
  uVar110 = (ulong)CARRY8(uVar69,local_140) + (ulong)CARRY8(uVar67,local_130);
  r->d[2] = uVar67 + local_130;
  uVar68 = (ulong)CARRY8(uVar110,local_138);
  r->d[3] = uVar110 + local_138;
  uVar1 = r->d[3];
  uVar69 = r->d[2];
  uVar67 = r->d[1];
  uVar76 = (uint)((0xfffffffffffffffd < uVar69 && uVar1 == 0xffffffffffffffff) &&
                 0xbaaedce6af48a03a < uVar67);
  uVar96 = 0;
  if (0xbaaedce6af48a03b < uVar67) {
    uVar96 = uVar76;
  }
  psVar120 = (secp256k1_gej *)r->d[0];
  uVar95 = 0;
  if ((secp256k1_gej *)0xbfd25e8cd0364140 < psVar120) {
    uVar95 = uVar76;
  }
  local_e0._0_4_ = (uint)CARRY8(uVar110,local_138);
  uVar96 = (uVar95 | uVar96 | (uVar69 == 0xffffffffffffffff && uVar1 == 0xffffffffffffffff)) +
           (uint)local_e0;
  a_01 = (secp256k1_fe *)(ulong)uVar96;
  local_118 = uVar79;
  local_110 = uVar106;
  local_e0 = uVar68;
  local_d8 = local_140;
  local_d0 = local_138;
  local_c8 = local_130;
  local_c0 = local_128;
  local_b8 = local_120;
  local_b0 = uVar79;
  local_a8 = uVar106;
  local_a0 = local_108;
  local_98 = local_100;
  local_90 = local_f8;
  local_88 = local_f0;
  local_80 = local_e8;
  if (uVar96 < 2) {
    uVar68 = (ulong)uVar96;
    uVar66 = (ulong)CARRY8(uVar68 * 0x402da1732fc9bebf,(ulong)psVar120);
    uVar73 = uVar68 * 0x4551231950b75fc4 + uVar67;
    r->d[0] = uVar68 * 0x402da1732fc9bebf + (long)psVar120;
    r->d[1] = uVar73 + uVar66;
    uVar66 = (ulong)(CARRY8(uVar68 * 0x4551231950b75fc4,uVar67) || CARRY8(uVar73,uVar66));
    r->d[2] = uVar69 + uVar68 + uVar66;
    r->d[3] = uVar1 + (CARRY8(uVar69,uVar68) || CARRY8(uVar69 + uVar68,uVar66));
    pcStack_150 = (code *)0x1427b1;
    secp256k1_scalar_verify(r);
    pcStack_150 = (code *)0x1427b9;
    secp256k1_scalar_verify(r);
    return;
  }
  pcStack_150 = secp256k1_gej_eq_x_var;
  secp256k1_scalar_mul_cold_1();
  uStack_158 = uVar63;
  psStack_198 = (secp256k1_fe *)0x1427e4;
  psVar90 = psVar120;
  uStack_160 = uVar73;
  pcStack_150 = (code *)uVar66;
  secp256k1_fe_verify(a_01);
  psStack_198 = (secp256k1_fe *)0x1427ec;
  psVar92 = psVar120;
  secp256k1_gej_verify(psVar120);
  if (psVar120->infinity == 0) {
    psStack_198 = (secp256k1_fe *)0x142804;
    secp256k1_fe_sqr(&sStack_190,&psVar120->z);
    psStack_198 = (secp256k1_fe *)0x142812;
    secp256k1_fe_mul(&sStack_190,&sStack_190,a_01);
    psStack_198 = (secp256k1_fe *)0x14281d;
    secp256k1_fe_equal(&sStack_190,&psVar120->x);
    return;
  }
  psStack_198 = (secp256k1_fe *)secp256k1_fe_cmp_var;
  secp256k1_gej_eq_x_var_cold_1();
  psStack_1b0 = (secp256k1_gej *)0x14283b;
  psVar91 = psVar90;
  psStack_1a0 = psVar120;
  psStack_198 = a_01;
  secp256k1_fe_verify(&psVar92->x);
  psStack_1b0 = (secp256k1_gej *)0x142843;
  psVar120 = psVar90;
  secp256k1_fe_verify(&psVar90->x);
  if ((psVar92->x).normalized == 0) {
    psStack_1b0 = (secp256k1_gej *)0x142885;
    secp256k1_fe_cmp_var_cold_2();
  }
  else if ((psVar90->x).normalized != 0) {
    uVar96 = 4;
    while( true ) {
      uVar66 = (psVar90->x).n[uVar96];
      uVar73 = (psVar92->x).n[uVar96];
      if (uVar73 >= uVar66 && uVar73 != uVar66) {
        return;
      }
      if (uVar73 < uVar66) break;
      bVar121 = uVar96 == 0;
      uVar96 = uVar96 - 1;
      if (bVar121) {
        return;
      }
    }
    return;
  }
  psStack_1b0 = (secp256k1_gej *)secp256k1_fe_add;
  secp256k1_fe_cmp_var_cold_1();
  psStack_1c8 = (secp256k1_scalar *)0x142899;
  psVar97 = psVar91;
  psStack_1b8 = psVar90;
  psStack_1b0 = psVar92;
  secp256k1_fe_verify(&psVar120->x);
  psStack_1c8 = (secp256k1_scalar *)0x1428a1;
  psVar90 = psVar91;
  secp256k1_fe_verify(&psVar91->x);
  iVar64 = (psVar91->x).magnitude + (psVar120->x).magnitude;
  if (iVar64 < 0x21) {
    (psVar120->x).n[0] = (psVar120->x).n[0] + (psVar91->x).n[0];
    puVar112 = (psVar120->x).n + 1;
    *puVar112 = *puVar112 + (psVar91->x).n[1];
    puVar112 = (psVar120->x).n + 2;
    *puVar112 = *puVar112 + (psVar91->x).n[2];
    puVar112 = (psVar120->x).n + 3;
    *puVar112 = *puVar112 + (psVar91->x).n[3];
    puVar112 = (psVar120->x).n + 4;
    *puVar112 = *puVar112 + (psVar91->x).n[4];
    (psVar120->x).magnitude = iVar64;
    (psVar120->x).normalized = 0;
    secp256k1_fe_verify(&psVar120->x);
    return;
  }
  psStack_1c8 = (secp256k1_scalar *)secp256k1_modinv64_var;
  secp256k1_fe_add_cold_1();
  auStack_248._16_8_ = 0;
  auStack_248._24_8_ = 0;
  auStack_248._0_8_ = 0;
  auStack_248._8_8_ = 0;
  psVar92 = (secp256k1_gej *)0x0;
  auStack_248._32_8_ = 0;
  auStack_248._56_8_ = 0;
  auStack_248._80_8_ = 0;
  auStack_248._64_8_ = 0;
  auStack_248._72_8_ = 0;
  auStack_248._48_8_ = 1;
  uStack_278 = (psVar97->x).n[4];
  auStack_2c8._48_8_ = (psVar97->x).n[0];
  uStack_290 = (psVar97->x).n[1];
  uStack_288 = (psVar97->x).n[2];
  uStack_280 = (psVar97->x).n[3];
  auStack_2c8._32_8_ = (psVar90->x).n[4];
  auStack_2c8._0_8_ = (psVar90->x).n[0];
  auStack_2c8._8_8_ = (psVar90->x).n[1];
  auStack_2c8._16_8_ = (psVar90->x).n[2];
  auStack_2c8._24_8_ = (psVar90->x).n[3];
  lVar119 = -1;
  psVar87 = (secp256k1_gej *)0x5;
  psStack_2e0 = psVar90;
  apsStack_2d8[0] = psVar97;
  auStack_248._88_8_ = psVar120;
  uStack_1e8 = uVar106;
  uStack_1e0 = uVar79;
  psStack_1d8 = psVar91;
  uStack_1d0 = uVar66;
  psStack_1c8 = r;
  do {
    psVar120 = (secp256k1_gej *)auStack_2c8._48_8_;
    psVar88 = apsStack_2d8[0];
    uStack_2e4 = (uint)psVar87;
    psVar70 = (secp256k1_gej *)0x0;
    psVar111 = (secp256k1_gej *)0x0;
    psVar102 = (secp256k1_gej *)0x1;
    uVar96 = 0x3e;
    psVar91 = (secp256k1_gej *)0x1;
    puVar114 = (undefined1 *)auStack_2c8._0_8_;
    psVar90 = (secp256k1_gej *)auStack_2c8._48_8_;
    while( true ) {
      a_02 = (secp256k1_gej *)(-1L << ((byte)uVar96 & 0x3f) | (ulong)puVar114);
      psVar77 = (secp256k1_gej *)0x0;
      if (a_02 != (secp256k1_gej *)0x0) {
        for (; ((ulong)a_02 >> (long)psVar77 & 1) == 0;
            psVar77 = (secp256k1_gej *)((long)(psVar77->x).n + 1)) {
        }
      }
      bVar75 = (byte)psVar77;
      psVar115 = (secp256k1_gej *)((ulong)puVar114 >> (bVar75 & 0x3f));
      psVar91 = (secp256k1_gej *)((long)psVar91 << (bVar75 & 0x3f));
      psVar70 = (secp256k1_gej *)((long)psVar70 << (bVar75 & 0x3f));
      lVar119 = lVar119 - (long)psVar77;
      uVar96 = uVar96 - (int)psVar77;
      apsStack_2d8[1] = psVar92;
      if (uVar96 == 0) break;
      if (((ulong)psVar90 & 1) == 0) {
        pcStack_2f0 = (code *)0x142e13;
        secp256k1_modinv64_var_cold_8();
LAB_00142e13:
        pcStack_2f0 = (code *)0x142e18;
        secp256k1_modinv64_var_cold_7();
LAB_00142e18:
        pcStack_2f0 = (code *)0x142e1d;
        secp256k1_modinv64_var_cold_1();
LAB_00142e1d:
        pcStack_2f0 = (code *)0x142e22;
        secp256k1_modinv64_var_cold_2();
LAB_00142e22:
        pcStack_2f0 = (code *)0x142e27;
        secp256k1_modinv64_var_cold_6();
        psVar115 = psVar90;
        goto LAB_00142e27;
      }
      if (((ulong)psVar115 & 1) == 0) goto LAB_00142e13;
      a_02 = (secp256k1_gej *)
             ((long)psVar70 * auStack_2c8._0_8_ + (long)psVar91 * auStack_2c8._48_8_);
      psVar77 = (secp256k1_gej *)(ulong)(0x3e - uVar96);
      bVar75 = (byte)(0x3e - uVar96);
      psVar87 = (secp256k1_gej *)((long)psVar90 << (bVar75 & 0x3f));
      if (a_02 != psVar87) goto LAB_00142e18;
      psVar87 = (secp256k1_gej *)
                ((long)psVar102 * auStack_2c8._0_8_ + (long)psVar111 * auStack_2c8._48_8_);
      a_02 = (secp256k1_gej *)((long)psVar115 << (bVar75 & 0x3f));
      if (psVar87 != a_02) goto LAB_00142e1d;
      psVar77 = (secp256k1_gej *)(lVar119 - 0x2ea);
      if (psVar77 < (secp256k1_gej *)0xfffffffffffffa2d) goto LAB_00142e22;
      iVar64 = (int)psVar115;
      if (lVar119 < 0) {
        lVar119 = -lVar119;
        uVar76 = (int)lVar119 + 1;
        if ((int)uVar96 <= (int)uVar76) {
          uVar76 = uVar96;
        }
        psVar77 = (secp256k1_gej *)(ulong)uVar76;
        a_02 = (secp256k1_gej *)(ulong)(uVar76 - 0x3f);
        if (0xffffffc1 < uVar76 - 0x3f) {
          psVar117 = (secp256k1_gej *)-(long)psVar70;
          r = (secp256k1_scalar *)-(long)psVar91;
          psVar77 = (secp256k1_gej *)-(long)psVar90;
          psVar87 = (secp256k1_gej *)
                    ((ulong)(0x3fL << (-(char)uVar76 & 0x3fU)) >> (-(char)uVar76 & 0x3fU));
          uVar76 = (iVar64 * iVar64 + 0x3e) * iVar64 * (int)psVar77 & (uint)psVar87;
          psVar70 = psVar102;
          psVar91 = psVar111;
          psVar97 = psVar117;
          goto LAB_00142aed;
        }
        goto LAB_00142e31;
      }
      uVar76 = (int)lVar119 + 1;
      if ((int)uVar96 <= (int)uVar76) {
        uVar76 = uVar96;
      }
      psVar77 = (secp256k1_gej *)(ulong)uVar76;
      a_02 = (secp256k1_gej *)(ulong)(uVar76 - 0x3f);
      if (uVar76 - 0x3f < 0xffffffc2) goto LAB_00142e2c;
      psVar87 = (secp256k1_gej *)
                ((ulong)(0xfL << (-(char)uVar76 & 0x3fU)) >> (-(char)uVar76 & 0x3fU));
      uVar76 = -(iVar64 * (((int)psVar90 * 2 + 2U & 8) + (int)psVar90)) & (uint)psVar87;
      r = (secp256k1_scalar *)psVar111;
      psVar117 = psVar102;
      psVar77 = psVar115;
      psVar115 = psVar90;
LAB_00142aed:
      uVar66 = (ulong)uVar76;
      a_02 = (secp256k1_gej *)(uVar66 * (long)psVar115);
      puVar114 = (undefined1 *)((long)(psVar77->x).n + (long)(a_02->x).n);
      psVar111 = (secp256k1_gej *)((long)(((secp256k1_gej *)r)->x).n + (long)psVar91 * uVar66);
      psVar77 = (secp256k1_gej *)(uVar66 * (long)psVar70);
      psVar102 = (secp256k1_gej *)((long)(psVar117->x).n + (long)(psVar77->x).n);
      psVar90 = psVar115;
      if (((ulong)puVar114 & (ulong)psVar87) != 0) {
LAB_00142e27:
        pcStack_2f0 = (code *)0x142e2c;
        secp256k1_modinv64_var_cold_4();
        psVar90 = psVar115;
LAB_00142e2c:
        pcStack_2f0 = (code *)0x142e31;
        secp256k1_modinv64_var_cold_3();
LAB_00142e31:
        pcStack_2f0 = (code *)0x142e36;
        secp256k1_modinv64_var_cold_5();
        goto LAB_00142e36;
      }
    }
    a_02 = (secp256k1_gej *)((long)psVar70 * (long)psVar111);
    psVar77 = SUB168(SEXT816((long)psVar70) * SEXT816((long)psVar111),8);
    sStack_268.u = (int64_t)psVar91;
    sStack_268.v = (int64_t)psVar70;
    sStack_268.q = (int64_t)psVar111;
    sStack_268.r = (int64_t)psVar102;
    if ((long)psVar91 * (long)psVar102 - (long)a_02 != 0x4000000000000000 ||
        SUB168(SEXT816((long)psVar91) * SEXT816((long)psVar102),8) - (long)psVar77 !=
        (ulong)((secp256k1_gej *)((long)psVar91 * (long)psVar102) < a_02)) {
LAB_00142e36:
      pcStack_2f0 = (code *)0x142e3b;
      secp256k1_modinv64_var_cold_9();
      psVar88 = psVar97;
LAB_00142e3b:
      pcStack_2f0 = (code *)0x142e40;
      secp256k1_modinv64_var_cold_20();
LAB_00142e40:
      pcStack_2f0 = (code *)0x142e45;
      secp256k1_modinv64_var_cold_19();
LAB_00142e45:
      pcStack_2f0 = (code *)0x142e4a;
      secp256k1_modinv64_var_cold_18();
      psVar92 = psVar120;
LAB_00142e4a:
      pcStack_2f0 = (code *)0x142e4f;
      secp256k1_modinv64_var_cold_17();
LAB_00142e4f:
      pcStack_2f0 = (code *)0x142e54;
      secp256k1_modinv64_var_cold_14();
LAB_00142e54:
      pcStack_2f0 = (code *)0x142e59;
      secp256k1_modinv64_var_cold_13();
LAB_00142e59:
      pcStack_2f0 = (code *)0x142e5e;
      secp256k1_modinv64_var_cold_12();
LAB_00142e5e:
      pcStack_2f0 = (code *)0x142e63;
      secp256k1_modinv64_var_cold_11();
LAB_00142e63:
      pcStack_2f0 = (code *)0x142e68;
      secp256k1_modinv64_var_cold_10();
      goto LAB_00142e68;
    }
    pcStack_2f0 = (code *)0x142b7b;
    secp256k1_modinv64_update_de_62
              ((secp256k1_modinv64_signed62 *)auStack_248,
               (secp256k1_modinv64_signed62 *)(auStack_248 + 0x30),&sStack_268,
               (secp256k1_modinv64_modinfo *)apsStack_2d8[0]);
    uVar96 = uStack_2e4;
    psVar90 = (secp256k1_gej *)(auStack_2c8 + 0x30);
    psVar87 = (secp256k1_gej *)(ulong)uStack_2e4;
    psVar91 = (secp256k1_gej *)(ulong)uStack_2e4;
    psVar77 = (secp256k1_gej *)0xffffffffffffffff;
    pcStack_2f0 = (code *)0x142b98;
    a_02 = psVar90;
    iVar64 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar90,uStack_2e4,
                        (secp256k1_modinv64_signed62 *)psVar88,-1);
    if (iVar64 < 1) goto LAB_00142e3b;
    psVar77 = (secp256k1_gej *)0x1;
    psVar91 = (secp256k1_gej *)(ulong)uVar96;
    pcStack_2f0 = (code *)0x142bb2;
    a_02 = psVar90;
    iVar64 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar90,uVar96,
                        (secp256k1_modinv64_signed62 *)psVar88,1);
    if (0 < iVar64) goto LAB_00142e40;
    psVar120 = (secp256k1_gej *)auStack_2c8;
    psVar91 = (secp256k1_gej *)(ulong)uVar96;
    psVar77 = (secp256k1_gej *)0xffffffffffffffff;
    pcStack_2f0 = (code *)0x142bd3;
    a_02 = psVar120;
    iVar64 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar120,uVar96,
                        (secp256k1_modinv64_signed62 *)psVar88,-1);
    if (iVar64 < 1) goto LAB_00142e45;
    psVar77 = (secp256k1_gej *)0x1;
    psVar91 = (secp256k1_gej *)(ulong)uVar96;
    pcStack_2f0 = (code *)0x142bed;
    a_02 = psVar120;
    iVar64 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar120,uVar96,
                        (secp256k1_modinv64_signed62 *)psVar88,1);
    psVar92 = psVar120;
    if (-1 < iVar64) goto LAB_00142e4a;
    pcStack_2f0 = (code *)0x142c0a;
    secp256k1_modinv64_update_fg_62_var
              (uVar96,(secp256k1_modinv64_signed62 *)psVar90,(secp256k1_modinv64_signed62 *)psVar120
               ,&sStack_268);
    psVar92 = apsStack_2d8[1];
    if ((undefined1 *)auStack_2c8._0_8_ != (undefined1 *)0x0) {
LAB_00142c1b:
      lVar83 = (long)(int)uVar96;
      uVar66 = *(ulong *)(auStack_2c8 + lVar83 * 8 + 0x28);
      psVar77 = apsStack_2d8[lVar83 + 1];
      a_02 = (secp256k1_gej *)((long)uVar66 >> 0x3f ^ uVar66 | lVar83 + -2 >> 0x3f);
      psVar91 = (secp256k1_gej *)((long)psVar77 >> 0x3f ^ (ulong)psVar77 | (ulong)a_02);
      if (psVar91 == (secp256k1_gej *)0x0) {
        psVar87 = (secp256k1_gej *)(ulong)(uVar96 - 1);
        *(ulong *)(auStack_2c8 + lVar83 * 8 + 0x20) =
             *(ulong *)(auStack_2c8 + lVar83 * 8 + 0x20) | uVar66 << 0x3e;
        psVar77 = (secp256k1_gej *)((long)psVar77 << 0x3e);
        apsStack_2d8[lVar83] = (secp256k1_gej *)((ulong)apsStack_2d8[lVar83] | (ulong)psVar77);
      }
      if (10 < (int)psVar92) goto LAB_00142e4f;
      psVar77 = (secp256k1_gej *)0xffffffffffffffff;
      pcStack_2f0 = (code *)0x142c7e;
      iVar86 = (int)psVar87;
      psVar91 = psVar87;
      a_02 = psVar90;
      iVar64 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)psVar90,iVar86,
                          (secp256k1_modinv64_signed62 *)psVar88,-1);
      if (iVar64 < 1) goto LAB_00142e54;
      psVar77 = (secp256k1_gej *)0x1;
      pcStack_2f0 = (code *)0x142c98;
      psVar91 = psVar87;
      a_02 = psVar90;
      iVar64 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)psVar90,iVar86,
                          (secp256k1_modinv64_signed62 *)psVar88,1);
      if (0 < iVar64) goto LAB_00142e59;
      psVar90 = (secp256k1_gej *)auStack_2c8;
      psVar77 = (secp256k1_gej *)0xffffffffffffffff;
      pcStack_2f0 = (code *)0x142cb9;
      psVar91 = psVar87;
      a_02 = psVar90;
      iVar64 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)psVar90,iVar86,
                          (secp256k1_modinv64_signed62 *)psVar88,-1);
      if (iVar64 < 1) goto LAB_00142e5e;
      psVar77 = (secp256k1_gej *)0x1;
      pcStack_2f0 = (code *)0x142cd3;
      psVar91 = psVar87;
      a_02 = psVar90;
      iVar64 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)psVar90,iVar86,
                          (secp256k1_modinv64_signed62 *)psVar88,1);
      if (iVar64 < 0) {
        bVar121 = true;
        psVar92 = (secp256k1_gej *)(ulong)((int)psVar92 + 1);
        goto LAB_00142d08;
      }
      goto LAB_00142e63;
    }
    if (1 < (int)uVar96) {
      uVar66 = 1;
      uVar73 = 0;
      do {
        uVar73 = uVar73 | *(ulong *)(auStack_2c8 + uVar66 * 8);
        uVar66 = uVar66 + 1;
      } while (uVar96 != uVar66);
      if (uVar73 != 0) goto LAB_00142c1b;
    }
    bVar121 = false;
LAB_00142d08:
    psVar97 = psVar88;
  } while (bVar121);
  a_02 = (secp256k1_gej *)auStack_2c8;
  iVar86 = (int)psVar87;
  psVar77 = (secp256k1_gej *)0x0;
  pcStack_2f0 = (code *)0x142d25;
  psVar91 = psVar87;
  iVar64 = secp256k1_modinv64_mul_cmp_62
                     ((secp256k1_modinv64_signed62 *)a_02,iVar86,&SECP256K1_SIGNED62_ONE,0);
  if (iVar64 == 0) {
    pcStack_2f0 = (code *)0x142d47;
    iVar64 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)(auStack_2c8 + 0x30),iVar86,
                        &SECP256K1_SIGNED62_ONE,-1);
    psVar92 = psStack_2e0;
    if (iVar64 == 0) {
LAB_00142dc9:
      pcStack_2f0 = (code *)0x142de4;
      secp256k1_modinv64_normalize_62
                ((secp256k1_modinv64_signed62 *)auStack_248,
                 *(int64_t *)(auStack_2c8 + (long)iVar86 * 8 + 0x28),
                 (secp256k1_modinv64_modinfo *)psVar88);
      (psVar92->x).n[4] = auStack_248._32_8_;
      (psVar92->x).n[2] = auStack_248._16_8_;
      (psVar92->x).n[3] = auStack_248._24_8_;
      (psVar92->x).n[0] = auStack_248._0_8_;
      (psVar92->x).n[1] = auStack_248._8_8_;
      return;
    }
    pcStack_2f0 = (code *)0x142d68;
    iVar64 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)(auStack_2c8 + 0x30),iVar86,
                        &SECP256K1_SIGNED62_ONE,1);
    if (iVar64 == 0) goto LAB_00142dc9;
    psVar91 = (secp256k1_gej *)0x5;
    psVar77 = (secp256k1_gej *)0x0;
    pcStack_2f0 = (code *)0x142d82;
    a_02 = psVar92;
    iVar64 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar92,5,&SECP256K1_SIGNED62_ONE,0);
    if (iVar64 == 0) {
      a_02 = (secp256k1_gej *)auStack_248;
      psVar91 = (secp256k1_gej *)0x5;
      psVar77 = (secp256k1_gej *)0x0;
      pcStack_2f0 = (code *)0x142da5;
      iVar64 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)a_02,5,&SECP256K1_SIGNED62_ONE,0);
      if (iVar64 == 0) {
        a_02 = (secp256k1_gej *)(auStack_2c8 + 0x30);
        psVar77 = (secp256k1_gej *)0x1;
        pcStack_2f0 = (code *)0x142dc1;
        psVar91 = psVar87;
        iVar64 = secp256k1_modinv64_mul_cmp_62
                           ((secp256k1_modinv64_signed62 *)a_02,iVar86,
                            (secp256k1_modinv64_signed62 *)psVar88,1);
        if (iVar64 == 0) goto LAB_00142dc9;
      }
    }
  }
  else {
LAB_00142e68:
    pcStack_2f0 = (code *)0x142e6d;
    secp256k1_modinv64_var_cold_15();
  }
  pcStack_2f0 = secp256k1_scalar_from_signed62;
  secp256k1_modinv64_var_cold_16();
  uVar66 = (psVar91->x).n[0];
  if (uVar66 >> 0x3e == 0) {
    uVar73 = (psVar91->x).n[1];
    if (0x3fffffffffffffff < uVar73) goto LAB_00142efc;
    psVar77 = (secp256k1_gej *)(psVar91->x).n[2];
    if ((secp256k1_gej *)0x3fffffffffffffff < psVar77) goto LAB_00142f01;
    uVar69 = (psVar91->x).n[3];
    if (0x3fffffffffffffff < uVar69) goto LAB_00142f06;
    psVar91 = (secp256k1_gej *)(psVar91->x).n[4];
    if (psVar91 < (secp256k1_gej *)&DAT_00000100) {
      (a_02->x).n[0] = uVar73 << 0x3e | uVar66;
      (a_02->x).n[1] = (long)psVar77 << 0x3c | uVar73 >> 2;
      (a_02->x).n[2] = uVar69 << 0x3a | (ulong)psVar77 >> 4;
      (a_02->x).n[3] = (long)psVar91 << 0x38 | uVar69 >> 6;
      secp256k1_scalar_verify((secp256k1_scalar *)a_02);
      return;
    }
  }
  else {
    psStack_2f8 = (secp256k1_gej *)0x142efc;
    secp256k1_scalar_from_signed62_cold_5();
LAB_00142efc:
    psStack_2f8 = (secp256k1_gej *)0x142f01;
    secp256k1_scalar_from_signed62_cold_4();
LAB_00142f01:
    psStack_2f8 = (secp256k1_gej *)0x142f06;
    secp256k1_scalar_from_signed62_cold_3();
LAB_00142f06:
    psStack_2f8 = (secp256k1_gej *)0x142f0b;
    secp256k1_scalar_from_signed62_cold_2();
  }
  psStack_2f8 = (secp256k1_gej *)secp256k1_modinv64_update_de_62;
  secp256k1_scalar_from_signed62_cold_1();
  psStack_2f8 = (secp256k1_gej *)r;
  lStack_300 = lVar119;
  psStack_308 = psVar92;
  psStack_310 = psVar90;
  psStack_318 = psVar88;
  psStack_320 = psVar87;
  uVar1 = (a_02->x).n[0];
  psStack_330 = (secp256k1_gej *)(a_02->x).n[1];
  psStack_340 = (secp256k1_gej *)(a_02->x).n[2];
  uStack_360 = (a_02->x).n[3];
  psStack_350 = (secp256k1_gej *)(a_02->x).n[4];
  psVar120 = (secp256k1_gej *)(psVar91->x).n[0];
  psStack_328 = (secp256k1_gej *)(psVar91->x).n[1];
  uStack_338 = (psVar91->x).n[2];
  uStack_398 = *extraout_RDX;
  psStack_390 = (secp256k1_gej *)extraout_RDX[1];
  uStack_3a8 = extraout_RDX[2];
  psStack_3a0 = (secp256k1_gej *)extraout_RDX[3];
  psVar90 = (secp256k1_gej *)(psVar91->x).n[3];
  psStack_358 = (secp256k1_gej *)(psVar91->x).n[4];
  psVar92 = (secp256k1_gej *)0x5;
  psVar87 = (secp256k1_gej *)0xfffffffffffffffe;
  psStack_3b0 = (secp256k1_gej *)0x142fac;
  psVar97 = a_02;
  iVar64 = secp256k1_modinv64_mul_cmp_62
                     ((secp256k1_modinv64_signed62 *)a_02,5,(secp256k1_modinv64_signed62 *)psVar77,
                      -2);
  if (iVar64 < 1) {
    psStack_3b0 = (secp256k1_gej *)0x143acc;
    secp256k1_modinv64_update_de_62_cold_34();
LAB_00143acc:
    psStack_3b0 = (secp256k1_gej *)0x143ad1;
    secp256k1_modinv64_update_de_62_cold_33();
LAB_00143ad1:
    psStack_3b0 = (secp256k1_gej *)0x143ad6;
    secp256k1_modinv64_update_de_62_cold_32();
LAB_00143ad6:
    psStack_3b0 = (secp256k1_gej *)0x143adb;
    secp256k1_modinv64_update_de_62_cold_31();
LAB_00143adb:
    psStack_3b0 = (secp256k1_gej *)0x143ae0;
    secp256k1_modinv64_update_de_62_cold_30();
LAB_00143ae0:
    psStack_3b0 = (secp256k1_gej *)0x143ae5;
    secp256k1_modinv64_update_de_62_cold_29();
LAB_00143ae5:
    psStack_3b0 = (secp256k1_gej *)0x143aea;
    secp256k1_modinv64_update_de_62_cold_1();
LAB_00143aea:
    psStack_3b0 = (secp256k1_gej *)0x143aef;
    secp256k1_modinv64_update_de_62_cold_2();
    psVar88 = psVar77;
LAB_00143aef:
    psStack_3b0 = (secp256k1_gej *)0x143af4;
    secp256k1_modinv64_update_de_62_cold_3();
LAB_00143af4:
    psStack_3b0 = (secp256k1_gej *)0x143af9;
    secp256k1_modinv64_update_de_62_cold_4();
LAB_00143af9:
    psStack_3b0 = (secp256k1_gej *)0x143afe;
    secp256k1_modinv64_update_de_62_cold_5();
    psVar70 = psVar88;
LAB_00143afe:
    psStack_3b0 = (secp256k1_gej *)0x143b03;
    secp256k1_modinv64_update_de_62_cold_6();
LAB_00143b03:
    psStack_3b0 = (secp256k1_gej *)0x143b08;
    secp256k1_modinv64_update_de_62_cold_7();
LAB_00143b08:
    psStack_3b0 = (secp256k1_gej *)0x143b0d;
    secp256k1_modinv64_update_de_62_cold_8();
LAB_00143b0d:
    psStack_3b0 = (secp256k1_gej *)0x143b12;
    secp256k1_modinv64_update_de_62_cold_11();
LAB_00143b12:
    psStack_3b0 = (secp256k1_gej *)0x143b17;
    secp256k1_modinv64_update_de_62_cold_12();
LAB_00143b17:
    psStack_3b0 = (secp256k1_gej *)0x143b1c;
    secp256k1_modinv64_update_de_62_cold_15();
LAB_00143b1c:
    psStack_3b0 = (secp256k1_gej *)0x143b21;
    secp256k1_modinv64_update_de_62_cold_16();
LAB_00143b21:
    psStack_3b0 = (secp256k1_gej *)0x143b26;
    secp256k1_modinv64_update_de_62_cold_19();
LAB_00143b26:
    psStack_3b0 = (secp256k1_gej *)0x143b2b;
    secp256k1_modinv64_update_de_62_cold_20();
LAB_00143b2b:
    psStack_3b0 = (secp256k1_gej *)0x143b30;
    secp256k1_modinv64_update_de_62_cold_21();
LAB_00143b30:
    psVar90 = psVar120;
    psVar91 = a_02;
    psStack_3b0 = (secp256k1_gej *)0x143b35;
    secp256k1_modinv64_update_de_62_cold_22();
LAB_00143b35:
    psStack_3b0 = (secp256k1_gej *)0x143b3a;
    secp256k1_modinv64_update_de_62_cold_28();
LAB_00143b3a:
    psStack_3b0 = (secp256k1_gej *)0x143b3f;
    secp256k1_modinv64_update_de_62_cold_27();
LAB_00143b3f:
    psStack_3b0 = (secp256k1_gej *)0x143b44;
    secp256k1_modinv64_update_de_62_cold_26();
LAB_00143b44:
    psStack_3b0 = (secp256k1_gej *)0x143b49;
    secp256k1_modinv64_update_de_62_cold_25();
LAB_00143b49:
    psStack_3b0 = (secp256k1_gej *)0x143b4e;
    secp256k1_modinv64_update_de_62_cold_24();
LAB_00143b4e:
    psStack_3b0 = (secp256k1_gej *)0x143b53;
    secp256k1_modinv64_update_de_62_cold_23();
    a_02 = psVar91;
    psVar102 = psVar90;
LAB_00143b53:
    psStack_3b0 = (secp256k1_gej *)0x143b58;
    secp256k1_modinv64_update_de_62_cold_9();
LAB_00143b58:
    psStack_3b0 = (secp256k1_gej *)0x143b5d;
    secp256k1_modinv64_update_de_62_cold_10();
LAB_00143b5d:
    psStack_3b0 = (secp256k1_gej *)0x143b62;
    secp256k1_modinv64_update_de_62_cold_13();
LAB_00143b62:
    psVar88 = psVar87;
    psStack_3b0 = (secp256k1_gej *)0x143b67;
    secp256k1_modinv64_update_de_62_cold_14();
LAB_00143b67:
    uVar96 = (uint)psVar92;
    psStack_3b0 = (secp256k1_gej *)0x143b6c;
    secp256k1_modinv64_update_de_62_cold_17();
  }
  else {
    psVar87 = (secp256k1_gej *)0x1;
    psVar92 = (secp256k1_gej *)0x5;
    psStack_3b0 = (secp256k1_gej *)0x142fc9;
    psVar97 = a_02;
    iVar64 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)a_02,5,(secp256k1_modinv64_signed62 *)psVar77
                        ,1);
    if (-1 < iVar64) goto LAB_00143acc;
    psVar92 = (secp256k1_gej *)0x5;
    psVar87 = (secp256k1_gej *)0xfffffffffffffffe;
    psStack_3b0 = (secp256k1_gej *)0x142fe8;
    psVar97 = psVar91;
    iVar64 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar91,5,
                        (secp256k1_modinv64_signed62 *)psVar77,-2);
    if (iVar64 < 1) goto LAB_00143ad1;
    psVar87 = (secp256k1_gej *)0x1;
    psVar92 = (secp256k1_gej *)0x5;
    psStack_3b0 = (secp256k1_gej *)0x143005;
    psVar97 = psVar91;
    iVar64 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar91,5,
                        (secp256k1_modinv64_signed62 *)psVar77,1);
    if (-1 < iVar64) goto LAB_00143ad6;
    psStack_3b0 = (secp256k1_gej *)0x14302b;
    psStack_370 = a_02;
    psStack_348 = psVar90;
    iVar71 = secp256k1_modinv64_abs(uStack_398);
    psStack_3b0 = (secp256k1_gej *)0x143038;
    psVar97 = psStack_390;
    iVar72 = secp256k1_modinv64_abs((int64_t)psStack_390);
    psVar87 = (secp256k1_gej *)(0x4000000000000000 - iVar72);
    a_02 = (secp256k1_gej *)0x3fffffffffffffff;
    if ((long)psVar87 < iVar71) goto LAB_00143adb;
    psStack_3b0 = (secp256k1_gej *)0x143053;
    iVar71 = secp256k1_modinv64_abs(uStack_3a8);
    psStack_3b0 = (secp256k1_gej *)0x143060;
    psVar97 = psStack_3a0;
    iVar72 = secp256k1_modinv64_abs((int64_t)psStack_3a0);
    psVar90 = psStack_370;
    psVar87 = (secp256k1_gej *)(0x4000000000000000 - iVar72);
    if ((long)psVar87 < iVar71) goto LAB_00143ae0;
    a_02 = (secp256k1_gej *)0x7fffffffffffffff;
    psVar92 = (secp256k1_gej *)(uStack_398 * uVar1);
    psVar87 = SUB168(SEXT816((long)uStack_398) * SEXT816((long)uVar1),8);
    uVar66 = (long)psStack_390 * (long)psVar120;
    lVar83 = SUB168(SEXT816((long)psStack_390) * SEXT816((long)psVar120),8);
    lVar119 = (0x7fffffffffffffff - lVar83) - (long)psVar87;
    if (-1 < lVar83 &&
        (SBORROW8(0x7fffffffffffffff - lVar83,(long)psVar87) !=
        SBORROW8(lVar119,(ulong)((secp256k1_gej *)~uVar66 < psVar92))) !=
        (long)(lVar119 - (ulong)((secp256k1_gej *)~uVar66 < psVar92)) < 0) goto LAB_00143ae5;
    puVar112 = (uint64_t *)((long)(psVar92->x).n + uVar66);
    lVar113 = (long)(psVar87->x).n + (ulong)CARRY8(uVar66,(ulong)psVar92) + lVar83;
    uVar73 = uStack_3a8 * uVar1;
    lVar84 = SUB168(SEXT816((long)uStack_3a8) * SEXT816((long)uVar1),8);
    uVar69 = (long)psStack_3a0 * (long)psVar120;
    lVar85 = SUB168(SEXT816((long)psStack_3a0) * SEXT816((long)psVar120),8);
    uVar66 = (ulong)(-uVar69 - 1 < uVar73);
    lVar119 = (0x7fffffffffffffff - lVar85) - lVar84;
    lVar83 = lVar119 - uVar66;
    bVar121 = (SBORROW8(0x7fffffffffffffff - lVar85,lVar84) != SBORROW8(lVar119,uVar66)) ==
              lVar83 < 0;
    psVar87 = (secp256k1_gej *)CONCAT71((int7)((ulong)lVar83 >> 8),lVar85 < 0 || bVar121);
    if (lVar85 >= 0 && !bVar121) goto LAB_00143aea;
    psVar88 = (secp256k1_gej *)((long)psStack_358 >> 0x3f);
    lStack_380 = ((ulong)psStack_390 & (ulong)psVar88) + (uStack_398 & (long)psStack_350 >> 0x3f);
    uVar67 = uVar69 + uVar73;
    psVar97 = (secp256k1_gej *)(lVar85 + lVar84 + (ulong)CARRY8(uVar69,uVar73));
    uVar1 = (psVar77->x).n[0];
    psVar92 = *(secp256k1_gej **)&(psVar77->x).magnitude;
    psVar87 = (secp256k1_gej *)0x3fffffffffffffff;
    lStack_380 = lStack_380 - ((long)psVar92 * (long)puVar112 + lStack_380 & 0x3fffffffffffffffU);
    uVar73 = lStack_380 * uVar1;
    lVar83 = SUB168(SEXT816(lStack_380) * SEXT816((long)uVar1),8);
    uVar66 = (ulong)((undefined1 *)(-uVar73 - 1) < puVar112);
    lVar119 = (0x7fffffffffffffff - lVar83) - lVar113;
    psVar120 = (secp256k1_gej *)((-0x8000000000000000 - lVar83) - (ulong)(uVar73 != 0));
    bVar121 = (SBORROW8(0x7fffffffffffffff - lVar83,lVar113) != SBORROW8(lVar119,uVar66)) ==
              (long)(lVar119 - uVar66) < 0;
    if (lVar83 < 0) {
      bVar121 = (SBORROW8(lVar113,(long)psVar120) !=
                SBORROW8(lVar113 - (long)psVar120,(ulong)(puVar112 < (undefined1 *)-uVar73))) ==
                (long)((lVar113 - (long)psVar120) - (ulong)(puVar112 < (undefined1 *)-uVar73)) < 0;
    }
    psStack_378 = psVar91;
    psStack_368 = psVar77;
    if (!bVar121) goto LAB_00143aef;
    lVar119 = ((ulong)psVar88 & (ulong)psStack_3a0) + ((long)psStack_350 >> 0x3f & uStack_3a8);
    psVar88 = (secp256k1_gej *)(lVar119 - ((long)psVar92 * uVar67 + lVar119 & 0x3fffffffffffffff));
    lVar84 = lVar83 + lVar113 + (ulong)CARRY8(uVar73,(ulong)puVar112);
    uVar69 = (long)psVar88 * uVar1;
    lVar83 = SUB168(SEXT816((long)psVar88) * SEXT816((long)uVar1),8);
    uVar66 = (ulong)(-uVar69 - 1 < uVar67);
    lVar119 = (0x7fffffffffffffff - lVar83) - (long)psVar97;
    psVar92 = (secp256k1_gej *)((-0x8000000000000000 - lVar83) - (ulong)(uVar69 != 0));
    bVar121 = (SBORROW8(0x7fffffffffffffff - lVar83,(long)psVar97) != SBORROW8(lVar119,uVar66)) ==
              (long)(lVar119 - uVar66) < 0;
    if (lVar83 < 0) {
      bVar121 = (SBORROW8((long)psVar97,(long)psVar92) !=
                SBORROW8((long)psVar97 - (long)psVar92,(ulong)(uVar67 < -uVar69))) ==
                (long)(((long)psVar97 - (long)psVar92) - (ulong)(uVar67 < -uVar69)) < 0;
    }
    if (!bVar121) goto LAB_00143af4;
    lVar119 = (long)(psVar97->x).n + (ulong)CARRY8(uVar69,uVar67) + lVar83;
    if (((long)puVar112 + uVar73 & 0x3fffffffffffffff) != 0) goto LAB_00143af9;
    psVar70 = psVar88;
    if ((uVar69 + uVar67 & 0x3fffffffffffffff) != 0) goto LAB_00143afe;
    psVar70 = (secp256k1_gej *)0x8000000000000000;
    uVar66 = (ulong)((long)puVar112 + uVar73) >> 0x3e | lVar84 * 4;
    psVar87 = (secp256k1_gej *)0x7fffffffffffffff;
    uVar68 = uStack_398 * (long)psStack_330 + uVar66;
    psVar97 = (secp256k1_gej *)
              (SUB168(SEXT816((long)uStack_398) * SEXT816((long)psStack_330),8) + (lVar84 >> 0x3e) +
              (ulong)CARRY8(uStack_398 * (long)psStack_330,uVar66));
    uVar73 = (long)psStack_390 * (long)psStack_328;
    lVar85 = SUB168(SEXT816((long)psStack_390) * SEXT816((long)psStack_328),8);
    uVar66 = (ulong)(-uVar73 - 1 < uVar68);
    lVar83 = (0x7fffffffffffffff - lVar85) - (long)psVar97;
    lVar113 = (-0x8000000000000000 - lVar85) - (ulong)(uVar73 != 0);
    lVar84 = (long)psVar97 - lVar113;
    bVar121 = (SBORROW8(0x7fffffffffffffff - lVar85,(long)psVar97) != SBORROW8(lVar83,uVar66)) ==
              (long)(lVar83 - uVar66) < 0;
    if (lVar85 < 0) {
      bVar121 = (SBORROW8((long)psVar97,lVar113) != SBORROW8(lVar84,(ulong)(uVar68 < -uVar73))) ==
                (long)(lVar84 - (ulong)(uVar68 < -uVar73)) < 0;
    }
    psVar92 = (secp256k1_gej *)(ulong)bVar121;
    a_02 = psStack_330;
    psVar120 = psStack_328;
    psStack_388 = psVar88;
    if (bVar121 == false) goto LAB_00143b03;
    uVar66 = uVar69 + uVar67 >> 0x3e | lVar119 * 4;
    uVar69 = uVar68 + uVar73;
    psVar97 = (secp256k1_gej *)((long)(psVar97->x).n + (ulong)CARRY8(uVar68,uVar73) + lVar85);
    uVar67 = uStack_3a8 * (long)psStack_330 + uVar66;
    lVar85 = SUB168(SEXT816((long)uStack_3a8) * SEXT816((long)psStack_330),8) + (lVar119 >> 0x3e) +
             (ulong)CARRY8(uStack_3a8 * (long)psStack_330,uVar66);
    uVar73 = (long)psStack_3a0 * (long)psStack_328;
    lVar84 = SUB168(SEXT816((long)psStack_3a0) * SEXT816((long)psStack_328),8);
    uVar66 = (ulong)(-uVar73 - 1 < uVar67);
    lVar119 = (0x7fffffffffffffff - lVar84) - lVar85;
    lVar113 = (-0x8000000000000000 - lVar84) - (ulong)(uVar73 != 0);
    lVar83 = lVar85 - lVar113;
    bVar121 = (SBORROW8(0x7fffffffffffffff - lVar84,lVar85) != SBORROW8(lVar119,uVar66)) ==
              (long)(lVar119 - uVar66) < 0;
    if (lVar84 < 0) {
      bVar121 = (SBORROW8(lVar85,lVar113) != SBORROW8(lVar83,(ulong)(uVar67 < -uVar73))) ==
                (long)(lVar83 - (ulong)(uVar67 < -uVar73)) < 0;
    }
    psVar92 = (secp256k1_gej *)(ulong)bVar121;
    if (bVar121 == false) goto LAB_00143b08;
    a_02 = (secp256k1_gej *)0x7fffffffffffffff;
    uVar66 = uVar67 + uVar73;
    lVar119 = lVar85 + lVar84 + (ulong)CARRY8(uVar67,uVar73);
    uVar1 = (psVar77->x).n[1];
    if (uVar1 != 0) {
      uVar67 = uVar1 * lStack_380;
      lVar84 = SUB168(SEXT816((long)uVar1) * SEXT816(lStack_380),8);
      uVar73 = (ulong)(-uVar67 - 1 < uVar69);
      lVar83 = (0x7fffffffffffffff - lVar84) - (long)psVar97;
      psVar92 = (secp256k1_gej *)((-0x8000000000000000 - lVar84) - (ulong)(uVar67 != 0));
      bVar121 = (SBORROW8(0x7fffffffffffffff - lVar84,(long)psVar97) != SBORROW8(lVar83,uVar73)) ==
                (long)(lVar83 - uVar73) < 0;
      if (lVar84 < 0) {
        bVar121 = (SBORROW8((long)psVar97,(long)psVar92) !=
                  SBORROW8((long)psVar97 - (long)psVar92,(ulong)(uVar69 < -uVar67))) ==
                  (long)(((long)psVar97 - (long)psVar92) - (ulong)(uVar69 < -uVar67)) < 0;
      }
      psVar87 = psVar88;
      psVar102 = psStack_328;
      if (!bVar121) goto LAB_00143b53;
      uVar68 = uVar1 * (long)psVar88;
      lVar113 = SUB168(SEXT816((long)uVar1) * SEXT816((long)psVar88),8);
      uVar73 = (ulong)(-uVar68 - 1 < uVar66);
      lVar83 = (0x7fffffffffffffff - lVar113) - lVar119;
      lVar118 = (-0x8000000000000000 - lVar113) - (ulong)(uVar68 != 0);
      lVar85 = lVar119 - lVar118;
      psVar102 = (secp256k1_gej *)(lVar85 - (ulong)(uVar66 < -uVar68));
      bVar121 = (SBORROW8(0x7fffffffffffffff - lVar113,lVar119) != SBORROW8(lVar83,uVar73)) ==
                (long)(lVar83 - uVar73) < 0;
      if (lVar113 < 0) {
        bVar121 = (SBORROW8(lVar119,lVar118) != SBORROW8(lVar85,(ulong)(uVar66 < -uVar68))) ==
                  (long)psVar102 < 0;
      }
      psVar92 = (secp256k1_gej *)(ulong)bVar121;
      if (bVar121 != false) {
        bVar121 = CARRY8(uVar69,uVar67);
        uVar69 = uVar69 + uVar67;
        psVar97 = (secp256k1_gej *)((long)(psVar97->x).n + (ulong)bVar121 + lVar84);
        bVar121 = CARRY8(uVar66,uVar68);
        uVar66 = uVar66 + uVar68;
        lVar119 = lVar119 + lVar113 + (ulong)bVar121;
        goto LAB_00143427;
      }
      goto LAB_00143b58;
    }
LAB_00143427:
    uVar73 = (long)psVar97 << 2 | uVar69 >> 0x3e;
    uVar68 = uStack_398 * (long)psStack_340 + uVar73;
    psVar97 = (secp256k1_gej *)
              (((long)psVar97 >> 0x3e) +
               SUB168(SEXT816((long)uStack_398) * SEXT816((long)psStack_340),8) +
              (ulong)CARRY8(uStack_398 * (long)psStack_340,uVar73));
    uVar67 = (long)psStack_390 * uStack_338;
    lVar85 = SUB168(SEXT816((long)psStack_390) * SEXT816((long)uStack_338),8);
    uVar73 = (ulong)(-uVar67 - 1 < uVar68);
    lVar83 = (0x7fffffffffffffff - lVar85) - (long)psVar97;
    lVar113 = (-0x8000000000000000 - lVar85) - (ulong)(uVar67 != 0);
    lVar84 = (long)psVar97 - lVar113;
    (psStack_370->x).n[0] = uVar69 & 0x3fffffffffffffff;
    (psVar91->x).n[0] = uVar66 & 0x3fffffffffffffff;
    bVar121 = (SBORROW8((long)psVar97,lVar113) != SBORROW8(lVar84,(ulong)(uVar68 < -uVar67))) ==
              (long)(lVar84 - (ulong)(uVar68 < -uVar67)) < 0;
    psVar92 = (secp256k1_gej *)(ulong)bVar121;
    bVar58 = (SBORROW8(0x7fffffffffffffff - lVar85,(long)psVar97) != SBORROW8(lVar83,uVar73)) ==
             (long)(lVar83 - uVar73) < 0;
    if (lVar85 < 0) {
      bVar58 = bVar121;
    }
    psVar87 = psStack_340;
    psVar120 = psStack_370;
    if (!bVar58) goto LAB_00143b0d;
    uVar66 = uVar66 >> 0x3e | lVar119 << 2;
    uVar110 = uVar68 + uVar67;
    psVar97 = (secp256k1_gej *)((long)(psVar97->x).n + (ulong)CARRY8(uVar68,uVar67) + lVar85);
    uVar69 = uStack_3a8 * (long)psStack_340 + uVar66;
    lVar84 = SUB168(SEXT816((long)uStack_3a8) * SEXT816((long)psStack_340),8) + (lVar119 >> 0x3e) +
             (ulong)CARRY8(uStack_3a8 * (long)psStack_340,uVar66);
    uVar73 = (long)psStack_3a0 * uStack_338;
    lVar83 = SUB168(SEXT816((long)psStack_3a0) * SEXT816((long)uStack_338),8);
    uVar66 = (ulong)(-uVar73 - 1 < uVar69);
    lVar119 = (0x7fffffffffffffff - lVar83) - lVar84;
    psVar87 = (secp256k1_gej *)0x8000000000000000;
    psVar70 = (secp256k1_gej *)((-0x8000000000000000 - lVar83) - (ulong)(uVar73 != 0));
    bVar121 = (SBORROW8(0x7fffffffffffffff - lVar83,lVar84) != SBORROW8(lVar119,uVar66)) ==
              (long)(lVar119 - uVar66) < 0;
    if (lVar83 < 0) {
      bVar121 = (SBORROW8(lVar84,(long)psVar70) !=
                SBORROW8(lVar84 - (long)psVar70,(ulong)(uVar69 < -uVar73))) ==
                (long)((lVar84 - (long)psVar70) - (ulong)(uVar69 < -uVar73)) < 0;
    }
    psVar92 = (secp256k1_gej *)(ulong)bVar121;
    if (bVar121 == false) goto LAB_00143b12;
    uVar66 = uVar69 + uVar73;
    lVar119 = lVar84 + lVar83 + (ulong)CARRY8(uVar69,uVar73);
    uVar1 = (psVar77->x).n[2];
    if (uVar1 != 0) {
      uVar69 = uVar1 * lStack_380;
      lVar84 = SUB168(SEXT816((long)uVar1) * SEXT816(lStack_380),8);
      uVar73 = (ulong)(-uVar69 - 1 < uVar110);
      lVar83 = (0x7fffffffffffffff - lVar84) - (long)psVar97;
      psVar92 = (secp256k1_gej *)((-0x8000000000000000 - lVar84) - (ulong)(uVar69 != 0));
      bVar121 = (SBORROW8(0x7fffffffffffffff - lVar84,(long)psVar97) != SBORROW8(lVar83,uVar73)) ==
                (long)(lVar83 - uVar73) < 0;
      if (lVar84 < 0) {
        bVar121 = (SBORROW8((long)psVar97,(long)psVar92) !=
                  SBORROW8((long)psVar97 - (long)psVar92,(ulong)(uVar110 < -uVar69))) ==
                  (long)(((long)psVar97 - (long)psVar92) - (ulong)(uVar110 < -uVar69)) < 0;
      }
      psVar102 = psStack_370;
      if (!bVar121) goto LAB_00143b5d;
      uVar67 = uVar1 * (long)psVar88;
      lVar113 = SUB168(SEXT816((long)uVar1) * SEXT816((long)psVar88),8);
      uVar73 = (ulong)(-uVar67 - 1 < uVar66);
      lVar83 = (0x7fffffffffffffff - lVar113) - lVar119;
      lVar118 = (-0x8000000000000000 - lVar113) - (ulong)(uVar67 != 0);
      lVar85 = lVar119 - lVar118;
      psVar102 = (secp256k1_gej *)
                 (ulong)((SBORROW8(lVar119,lVar118) != SBORROW8(lVar85,(ulong)(uVar66 < -uVar67)))
                        == (long)(lVar85 - (ulong)(uVar66 < -uVar67)) < 0);
      psVar92 = (secp256k1_gej *)
                (ulong)((SBORROW8(0x7fffffffffffffff - lVar113,lVar119) != SBORROW8(lVar83,uVar73))
                       == (long)(lVar83 - uVar73) < 0);
      if (lVar113 < 0) {
        psVar92 = psVar102;
      }
      if ((char)psVar92 != '\0') {
        bVar121 = CARRY8(uVar110,uVar69);
        uVar110 = uVar110 + uVar69;
        psVar97 = (secp256k1_gej *)((long)(psVar97->x).n + (ulong)bVar121 + lVar84);
        bVar121 = CARRY8(uVar66,uVar67);
        uVar66 = uVar66 + uVar67;
        lVar119 = lVar119 + lVar113 + (ulong)bVar121;
        goto LAB_00143621;
      }
      goto LAB_00143b62;
    }
LAB_00143621:
    a_02 = (secp256k1_gej *)0x8000000000000000;
    psVar70 = (secp256k1_gej *)0x7fffffffffffffff;
    uVar73 = (long)psVar97 << 2 | uVar110 >> 0x3e;
    uVar67 = uStack_398 * uStack_360 + uVar73;
    psVar97 = (secp256k1_gej *)
              (((long)psVar97 >> 0x3e) +
               SUB168(SEXT816((long)uStack_398) * SEXT816((long)uStack_360),8) +
              (ulong)CARRY8(uStack_398 * uStack_360,uVar73));
    uVar69 = (long)psStack_390 * (long)psStack_348;
    lVar85 = SUB168(SEXT816((long)psStack_390) * SEXT816((long)psStack_348),8);
    uVar73 = (ulong)(-uVar69 - 1 < uVar67);
    lVar83 = (0x7fffffffffffffff - lVar85) - (long)psVar97;
    lVar113 = (-0x8000000000000000 - lVar85) - (ulong)(uVar69 != 0);
    lVar84 = (long)psVar97 - lVar113;
    (psStack_370->x).n[1] = uVar110 & 0x3fffffffffffffff;
    (psVar91->x).n[1] = uVar66 & 0x3fffffffffffffff;
    bVar121 = (SBORROW8((long)psVar97,lVar113) != SBORROW8(lVar84,(ulong)(uVar67 < -uVar69))) ==
              (long)(lVar84 - (ulong)(uVar67 < -uVar69)) < 0;
    psVar92 = (secp256k1_gej *)(ulong)bVar121;
    bVar58 = (SBORROW8(0x7fffffffffffffff - lVar85,(long)psVar97) != SBORROW8(lVar83,uVar73)) ==
             (long)(lVar83 - uVar73) < 0;
    if (lVar85 < 0) {
      bVar58 = bVar121;
    }
    psVar87 = psStack_348;
    if (!bVar58) goto LAB_00143b17;
    uVar66 = uVar66 >> 0x3e | lVar119 << 2;
    uVar68 = uVar67 + uVar69;
    psVar97 = (secp256k1_gej *)((long)(psVar97->x).n + (ulong)CARRY8(uVar67,uVar69) + lVar85);
    uVar69 = uStack_3a8 * uStack_360 + uVar66;
    lVar84 = SUB168(SEXT816((long)uStack_3a8) * SEXT816((long)uStack_360),8) + (lVar119 >> 0x3e) +
             (ulong)CARRY8(uStack_3a8 * uStack_360,uVar66);
    uVar73 = (long)psStack_3a0 * (long)psStack_348;
    lVar83 = SUB168(SEXT816((long)psStack_3a0) * SEXT816((long)psStack_348),8);
    uVar66 = (ulong)(-uVar73 - 1 < uVar69);
    lVar119 = (0x7fffffffffffffff - lVar83) - lVar84;
    psVar70 = (secp256k1_gej *)(lVar119 - uVar66);
    psVar87 = (secp256k1_gej *)0x8000000000000000;
    a_02 = (secp256k1_gej *)((-0x8000000000000000 - lVar83) - (ulong)(uVar73 != 0));
    bVar121 = (SBORROW8(0x7fffffffffffffff - lVar83,lVar84) != SBORROW8(lVar119,uVar66)) ==
              (long)psVar70 < 0;
    if (lVar83 < 0) {
      bVar121 = (SBORROW8(lVar84,(long)a_02) !=
                SBORROW8(lVar84 - (long)a_02,(ulong)(uVar69 < -uVar73))) ==
                (long)((lVar84 - (long)a_02) - (ulong)(uVar69 < -uVar73)) < 0;
    }
    psVar92 = (secp256k1_gej *)(ulong)bVar121;
    if (bVar121 == false) goto LAB_00143b1c;
    uVar66 = uVar69 + uVar73;
    lVar119 = lVar84 + lVar83 + (ulong)CARRY8(uVar69,uVar73);
    uVar1 = (psVar77->x).n[3];
    if (uVar1 == 0) {
LAB_00143804:
      a_02 = (secp256k1_gej *)0x8000000000000000;
      uVar73 = (long)psVar97 << 2 | uVar68 >> 0x3e;
      uVar67 = uStack_398 * (long)psStack_350 + uVar73;
      psVar97 = (secp256k1_gej *)
                (((long)psVar97 >> 0x3e) +
                 SUB168(SEXT816((long)uStack_398) * SEXT816((long)psStack_350),8) +
                (ulong)CARRY8(uStack_398 * (long)psStack_350,uVar73));
      uVar69 = (long)psStack_390 * (long)psStack_358;
      lVar85 = SUB168(SEXT816((long)psStack_390) * SEXT816((long)psStack_358),8);
      uVar73 = (ulong)(-uVar69 - 1 < uVar67);
      lVar83 = (0x7fffffffffffffff - lVar85) - (long)psVar97;
      lVar113 = (-0x8000000000000000 - lVar85) - (ulong)(uVar69 != 0);
      lVar84 = (long)psVar97 - lVar113;
      (psStack_370->x).n[2] = uVar68 & 0x3fffffffffffffff;
      (psVar91->x).n[2] = uVar66 & 0x3fffffffffffffff;
      bVar121 = (SBORROW8((long)psVar97,lVar113) != SBORROW8(lVar84,(ulong)(uVar67 < -uVar69))) ==
                (long)(lVar84 - (ulong)(uVar67 < -uVar69)) < 0;
      psVar92 = (secp256k1_gej *)(ulong)bVar121;
      bVar58 = (SBORROW8(0x7fffffffffffffff - lVar85,(long)psVar97) != SBORROW8(lVar83,uVar73)) ==
               (long)(lVar83 - uVar73) < 0;
      if (lVar85 < 0) {
        bVar58 = bVar121;
      }
      psVar87 = psStack_358;
      psVar70 = psStack_350;
      if (!bVar58) goto LAB_00143b21;
      uVar66 = uVar66 >> 0x3e | lVar119 << 2;
      uVar68 = uVar67 + uVar69;
      psVar97 = (secp256k1_gej *)((long)(psVar97->x).n + (ulong)CARRY8(uVar67,uVar69) + lVar85);
      uVar69 = uStack_3a8 * (long)psStack_350 + uVar66;
      lVar85 = SUB168(SEXT816((long)uStack_3a8) * SEXT816((long)psStack_350),8) + (lVar119 >> 0x3e)
               + (ulong)CARRY8(uStack_3a8 * (long)psStack_350,uVar66);
      uVar73 = (long)psStack_3a0 * (long)psStack_358;
      lVar84 = SUB168(SEXT816((long)psStack_3a0) * SEXT816((long)psStack_358),8);
      uVar66 = (ulong)(-uVar73 - 1 < uVar69);
      lVar119 = (0x7fffffffffffffff - lVar84) - lVar85;
      lVar113 = (-0x8000000000000000 - lVar84) - (ulong)(uVar73 != 0);
      lVar83 = lVar85 - lVar113;
      bVar121 = (SBORROW8(0x7fffffffffffffff - lVar84,lVar85) != SBORROW8(lVar119,uVar66)) ==
                (long)(lVar119 - uVar66) < 0;
      if (lVar84 < 0) {
        bVar121 = (SBORROW8(lVar85,lVar113) != SBORROW8(lVar83,(ulong)(uVar69 < -uVar73))) ==
                  (long)(lVar83 - (ulong)(uVar69 < -uVar73)) < 0;
      }
      psVar92 = (secp256k1_gej *)(ulong)bVar121;
      if (bVar121 == false) goto LAB_00143b26;
      uVar67 = uVar69 + uVar73;
      lVar83 = lVar85 + lVar84 + (ulong)CARRY8(uVar69,uVar73);
      uVar1 = (psVar77->x).n[4];
      uVar73 = uVar1 * lStack_380;
      psVar92 = SUB168(SEXT816((long)uVar1) * SEXT816(lStack_380),8);
      uVar66 = (ulong)(-uVar73 - 1 < uVar68);
      lVar119 = (0x7fffffffffffffff - (long)psVar92) - (long)psVar97;
      psVar120 = (secp256k1_gej *)((-0x8000000000000000 - (long)psVar92) - (ulong)(uVar73 != 0));
      bVar121 = (SBORROW8(0x7fffffffffffffff - (long)psVar92,(long)psVar97) !=
                SBORROW8(lVar119,uVar66)) == (long)(lVar119 - uVar66) < 0;
      if ((long)psVar92 < 0) {
        bVar121 = (SBORROW8((long)psVar97,(long)psVar120) !=
                  SBORROW8((long)psVar97 - (long)psVar120,(ulong)(uVar68 < -uVar73))) ==
                  (long)(((long)psVar97 - (long)psVar120) - (ulong)(uVar68 < -uVar73)) < 0;
      }
      if (!bVar121) goto LAB_00143b2b;
      uVar69 = uVar1 * (long)psVar88;
      lVar84 = SUB168(SEXT816((long)uVar1) * SEXT816((long)psVar88),8);
      psVar70 = (secp256k1_gej *)0x8000000000000000;
      uVar66 = (ulong)(-uVar69 - 1 < uVar67);
      lVar119 = (0x7fffffffffffffff - lVar84) - lVar83;
      a_02 = (secp256k1_gej *)((-0x8000000000000000 - lVar84) - (ulong)(uVar69 != 0));
      bVar121 = (SBORROW8(0x7fffffffffffffff - lVar84,lVar83) != SBORROW8(lVar119,uVar66)) ==
                (long)(lVar119 - uVar66) < 0;
      if (lVar84 < 0) {
        bVar121 = (SBORROW8(lVar83,(long)a_02) !=
                  SBORROW8(lVar83 - (long)a_02,(ulong)(uVar67 < -uVar69))) ==
                  (long)((lVar83 - (long)a_02) - (ulong)(uVar67 < -uVar69)) < 0;
      }
      psVar87 = (secp256k1_gej *)(ulong)bVar121;
      if (bVar121 == false) goto LAB_00143b30;
      lVar85 = (long)(psVar92->x).n + (ulong)CARRY8(uVar73,uVar68) + (long)(psVar97->x).n;
      lVar119 = lVar84 + lVar83 + (ulong)CARRY8(uVar69,uVar67);
      psVar87 = (secp256k1_gej *)(lVar85 * 4 | uVar73 + uVar68 >> 0x3e);
      (psStack_370->x).n[3] = uVar73 + uVar68 & 0x3fffffffffffffff;
      (psVar91->x).n[3] = uVar69 + uVar67 & 0x3fffffffffffffff;
      psVar97 = (secp256k1_gej *)&psVar87[0xd79435e50d7943].x.magnitude;
      psVar92 = (secp256k1_gej *)
                ((lVar85 >> 0x3e) + -1 + (ulong)((secp256k1_gej *)0x7fffffffffffffff < psVar87));
      if (psVar92 != (secp256k1_gej *)0xffffffffffffffff) goto LAB_00143b35;
      psVar92 = (secp256k1_gej *)0xffffffffffffffff;
      uVar66 = uVar69 + uVar67 >> 0x3e | lVar119 * 4;
      (psStack_370->x).n[4] = (uint64_t)psVar87;
      psVar70 = (secp256k1_gej *)(uVar66 + 0x8000000000000000);
      if ((lVar119 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar66) != -1) goto LAB_00143b3a;
      (psVar91->x).n[4] = uVar66;
      psVar92 = (secp256k1_gej *)0x5;
      psVar87 = (secp256k1_gej *)0xfffffffffffffffe;
      psStack_3b0 = (secp256k1_gej *)0x143a54;
      psVar97 = psStack_370;
      iVar64 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)psStack_370,5,
                          (secp256k1_modinv64_signed62 *)psVar77,-2);
      if (iVar64 < 1) goto LAB_00143b3f;
      psVar87 = (secp256k1_gej *)0x1;
      psVar92 = (secp256k1_gej *)0x5;
      psStack_3b0 = (secp256k1_gej *)0x143a71;
      psVar97 = psVar90;
      iVar64 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)psVar90,5,
                          (secp256k1_modinv64_signed62 *)psVar77,1);
      if (-1 < iVar64) goto LAB_00143b44;
      psVar92 = (secp256k1_gej *)0x5;
      psVar87 = (secp256k1_gej *)0xfffffffffffffffe;
      psStack_3b0 = (secp256k1_gej *)0x143a90;
      psVar97 = psVar91;
      iVar64 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)psVar91,5,
                          (secp256k1_modinv64_signed62 *)psVar77,-2);
      if (iVar64 < 1) goto LAB_00143b49;
      psVar87 = (secp256k1_gej *)0x1;
      psVar92 = (secp256k1_gej *)0x5;
      psStack_3b0 = (secp256k1_gej *)0x143aad;
      psVar97 = psVar91;
      iVar64 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)psVar91,5,
                          (secp256k1_modinv64_signed62 *)psVar77,1);
      if (iVar64 < 0) {
        return;
      }
      goto LAB_00143b4e;
    }
    psVar70 = (secp256k1_gej *)(uVar1 * lStack_380);
    lVar84 = SUB168(SEXT816((long)uVar1) * SEXT816(lStack_380),8);
    uVar73 = (ulong)(-(long)psVar70 - 1U < uVar68);
    lVar83 = (0x7fffffffffffffff - lVar84) - (long)psVar97;
    a_02 = (secp256k1_gej *)0x8000000000000000;
    psVar92 = (secp256k1_gej *)
              ((-0x8000000000000000 - lVar84) - (ulong)(psVar70 != (secp256k1_gej *)0x0));
    bVar121 = (SBORROW8(0x7fffffffffffffff - lVar84,(long)psVar97) != SBORROW8(lVar83,uVar73)) ==
              (long)(lVar83 - uVar73) < 0;
    if (lVar84 < 0) {
      bVar121 = (SBORROW8((long)psVar97,(long)psVar92) !=
                SBORROW8((long)psVar97 - (long)psVar92,(ulong)(uVar68 < (ulong)-(long)psVar70))) ==
                (long)(((long)psVar97 - (long)psVar92) - (ulong)(uVar68 < (ulong)-(long)psVar70)) <
                0;
    }
    psVar102 = psStack_370;
    if (!bVar121) goto LAB_00143b67;
    uVar69 = uVar1 * (long)psVar88;
    lVar113 = SUB168(SEXT816((long)uVar1) * SEXT816((long)psVar88),8);
    uVar73 = (ulong)(-uVar69 - 1 < uVar66);
    lVar83 = (0x7fffffffffffffff - lVar113) - lVar119;
    lVar118 = (-0x8000000000000000 - lVar113) - (ulong)(uVar69 != 0);
    lVar85 = lVar119 - lVar118;
    psVar102 = (secp256k1_gej *)(lVar85 - (ulong)(uVar66 < -uVar69));
    bVar121 = (SBORROW8(0x7fffffffffffffff - lVar113,lVar119) != SBORROW8(lVar83,uVar73)) ==
              (long)(lVar83 - uVar73) < 0;
    if (lVar113 < 0) {
      bVar121 = (SBORROW8(lVar119,lVar118) != SBORROW8(lVar85,(ulong)(uVar66 < -uVar69))) ==
                (long)psVar102 < 0;
    }
    uVar96 = (uint)bVar121;
    if (bVar121 != false) {
      bVar121 = CARRY8(uVar68,(ulong)psVar70);
      uVar68 = (long)(psVar70->x).n + uVar68;
      psVar97 = (secp256k1_gej *)((long)(psVar97->x).n + (ulong)bVar121 + lVar84);
      bVar121 = CARRY8(uVar66,uVar69);
      uVar66 = uVar66 + uVar69;
      lVar119 = lVar119 + lVar113 + (ulong)bVar121;
      goto LAB_00143804;
    }
  }
  psStack_3b0 = (secp256k1_gej *)secp256k1_modinv64_mul_cmp_62;
  secp256k1_modinv64_update_de_62_cold_18();
  a_03 = &sStack_410;
  psStack_3c0 = psVar70;
  psStack_3b8 = a_02;
  psStack_3b0 = psVar102;
  secp256k1_modinv64_mul_62(&sStack_3e8,(secp256k1_modinv64_signed62 *)psVar97,uVar96,1);
  psVar93 = a_00;
  secp256k1_modinv64_mul_62(&sStack_410,a_00,5,(int64_t)psVar88);
  lVar119 = 0;
  while ((ulong)sStack_3e8.v[lVar119] < 0x4000000000000000) {
    if (0x3fffffffffffffff < (ulong)sStack_410.v[lVar119]) goto LAB_00143c01;
    lVar119 = lVar119 + 1;
    if (lVar119 == 4) {
      uVar96 = 4;
      while( true ) {
        if (sStack_3e8.v[uVar96] < sStack_410.v[uVar96]) {
          return;
        }
        if (sStack_410.v[uVar96] < sStack_3e8.v[uVar96]) break;
        bVar121 = uVar96 == 0;
        uVar96 = uVar96 - 1;
        if (bVar121) {
          return;
        }
      }
      return;
    }
  }
  secp256k1_modinv64_mul_cmp_62_cold_2();
LAB_00143c01:
  secp256k1_modinv64_mul_cmp_62_cold_1();
  iVar64 = (int)a_03;
  if (iVar64 < 1) {
LAB_00143ec0:
    secp256k1_modinv64_update_fg_62_var_cold_9();
LAB_00143ec5:
    secp256k1_modinv64_update_fg_62_var_cold_1();
LAB_00143eca:
    secp256k1_modinv64_update_fg_62_var_cold_2();
LAB_00143ecf:
    secp256k1_modinv64_update_fg_62_var_cold_3();
LAB_00143ed4:
    secp256k1_modinv64_update_fg_62_var_cold_4();
LAB_00143ed9:
    secp256k1_modinv64_update_fg_62_var_cold_8();
  }
  else {
    uVar1 = (psVar88->x).n[0];
    uVar2 = (psVar88->x).n[1];
    lVar119 = psVar93->v[0];
    lVar83 = *extraout_RDX_00;
    uVar66 = lVar119 * uVar1;
    lVar85 = SUB168(SEXT816(lVar119) * SEXT816((long)uVar1),8);
    uVar73 = lVar83 * uVar2;
    lVar113 = SUB168(SEXT816(lVar83) * SEXT816((long)uVar2),8);
    lVar84 = (0x7fffffffffffffff - lVar113) - lVar85;
    if (-1 < lVar113 &&
        (SBORROW8(0x7fffffffffffffff - lVar113,lVar85) != SBORROW8(lVar84,(ulong)(~uVar73 < uVar66))
        ) != (long)(lVar84 - (ulong)(~uVar73 < uVar66)) < 0) goto LAB_00143ec5;
    uVar3 = (psVar88->x).n[2];
    lVar85 = lVar113 + lVar85 + (ulong)CARRY8(uVar73,uVar66);
    uVar4 = (psVar88->x).n[3];
    uVar67 = lVar119 * uVar3;
    lVar84 = SUB168(SEXT816(lVar119) * SEXT816((long)uVar3),8);
    uVar68 = lVar83 * uVar4;
    lVar83 = SUB168(SEXT816(lVar83) * SEXT816((long)uVar4),8);
    uVar69 = (ulong)(-uVar68 - 1 < uVar67);
    lVar119 = (0x7fffffffffffffff - lVar83) - lVar84;
    if (-1 < lVar83 &&
        (SBORROW8(0x7fffffffffffffff - lVar83,lVar84) != SBORROW8(lVar119,uVar69)) !=
        (long)(lVar119 - uVar69) < 0) goto LAB_00143eca;
    lVar119 = lVar83 + lVar84 + (ulong)CARRY8(uVar68,uVar67);
    if ((uVar73 + uVar66 & 0x3fffffffffffffff) != 0) goto LAB_00143ecf;
    if ((uVar68 + uVar67 & 0x3fffffffffffffff) != 0) goto LAB_00143ed4;
    uVar69 = uVar68 + uVar67 >> 0x3e | lVar119 * 4;
    uVar66 = uVar73 + uVar66 >> 0x3e | lVar85 * 4;
    lVar119 = lVar119 >> 0x3e;
    lVar85 = lVar85 >> 0x3e;
    if (iVar64 != 1) {
      psVar74 = (secp256k1_modinv64_signed62 *)((ulong)a_03 & 0xffffffff);
      a_03 = (secp256k1_modinv64_signed62 *)0x1;
      do {
        lVar83 = psVar93->v[(long)a_03];
        uVar67 = lVar83 * uVar1 + uVar66;
        lVar89 = SUB168(SEXT816(lVar83) * SEXT816((long)uVar1),8) + lVar85 +
                 (ulong)CARRY8(lVar83 * uVar1,uVar66);
        lVar84 = extraout_RDX_00[(long)a_03];
        uVar73 = lVar84 * uVar2;
        lVar118 = SUB168(SEXT816(lVar84) * SEXT816((long)uVar2),8);
        uVar66 = (ulong)(-uVar73 - 1 < uVar67);
        lVar85 = (0x7fffffffffffffff - lVar118) - lVar89;
        psVar94 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
        lVar116 = (-0x8000000000000000 - lVar118) - (ulong)(uVar73 != 0);
        lVar113 = lVar89 - lVar116;
        bVar121 = (SBORROW8(0x7fffffffffffffff - lVar118,lVar89) != SBORROW8(lVar85,uVar66)) ==
                  (long)(lVar85 - uVar66) < 0;
        if (lVar118 < 0) {
          bVar121 = (SBORROW8(lVar89,lVar116) != SBORROW8(lVar113,(ulong)(uVar67 < -uVar73))) ==
                    (long)(lVar113 - (ulong)(uVar67 < -uVar73)) < 0;
        }
        if (!bVar121) {
          secp256k1_modinv64_update_fg_62_var_cold_5();
LAB_00143ebb:
          psVar93 = psVar94;
          secp256k1_modinv64_update_fg_62_var_cold_6();
          goto LAB_00143ec0;
        }
        uVar110 = lVar83 * uVar3 + uVar69;
        lVar113 = SUB168(SEXT816(lVar83) * SEXT816((long)uVar3),8) + lVar119 +
                  (ulong)CARRY8(lVar83 * uVar3,uVar69);
        uVar68 = lVar84 * uVar4;
        lVar84 = SUB168(SEXT816(lVar84) * SEXT816((long)uVar4),8);
        uVar66 = (ulong)(-uVar68 - 1 < uVar110);
        lVar119 = (0x7fffffffffffffff - lVar84) - lVar113;
        lVar85 = (-0x8000000000000000 - lVar84) - (ulong)(uVar68 != 0);
        lVar83 = lVar113 - lVar85;
        bVar121 = (SBORROW8(0x7fffffffffffffff - lVar84,lVar113) != SBORROW8(lVar119,uVar66)) ==
                  (long)(lVar119 - uVar66) < 0;
        if (lVar84 < 0) {
          bVar121 = (SBORROW8(lVar113,lVar85) != SBORROW8(lVar83,(ulong)(uVar110 < -uVar68))) ==
                    (long)(lVar83 - (ulong)(uVar110 < -uVar68)) < 0;
        }
        if (!bVar121) goto LAB_00143ebb;
        lVar85 = lVar118 + lVar89 + (ulong)CARRY8(uVar73,uVar67);
        lVar119 = lVar84 + lVar113 + (ulong)CARRY8(uVar68,uVar110);
        uVar66 = lVar85 * 4 | uVar73 + uVar67 >> 0x3e;
        psVar93->v[(long)((long)a_03[-1].v + 0x27)] = uVar73 + uVar67 & 0x3fffffffffffffff;
        uVar69 = lVar119 * 4 | uVar68 + uVar110 >> 0x3e;
        extraout_RDX_00[(long)((long)a_03[-1].v + 0x27)] = uVar68 + uVar110 & 0x3fffffffffffffff;
        a_03 = (secp256k1_modinv64_signed62 *)((long)a_03->v + 1);
        lVar119 = lVar119 >> 0x3e;
        lVar85 = lVar85 >> 0x3e;
      } while (psVar74 != a_03);
    }
    if (lVar85 + -1 + (ulong)(0x7fffffffffffffff < uVar66) != -1) goto LAB_00143ed9;
    psVar93->v[(long)iVar64 + -1] = uVar66;
    if (lVar119 + -1 + (ulong)(0x7fffffffffffffff < uVar69) == -1) {
      extraout_RDX_00[(long)iVar64 + -1] = uVar69;
      return;
    }
  }
  secp256k1_modinv64_update_fg_62_var_cold_7();
  lVar119 = a_03->v[0];
  lVar83 = a_03->v[1];
  lVar84 = a_03->v[2];
  lVar85 = a_03->v[3];
  lVar113 = a_03->v[4];
  lVar118 = 0;
  do {
    if (a_03->v[lVar118] < -0x3fffffffffffffff) {
      secp256k1_modinv64_normalize_62_cold_7();
LAB_0014410f:
      secp256k1_modinv64_normalize_62_cold_6();
      goto LAB_00144114;
    }
    if (0x3fffffffffffffff < a_03->v[lVar118]) goto LAB_0014410f;
    lVar118 = lVar118 + 1;
  } while (lVar118 != 5);
  iVar64 = secp256k1_modinv64_mul_cmp_62(a_03,5,b_00,-2);
  if (iVar64 < 1) {
LAB_00144114:
    secp256k1_modinv64_normalize_62_cold_5();
LAB_00144119:
    secp256k1_modinv64_normalize_62_cold_4();
LAB_0014411e:
    secp256k1_modinv64_normalize_62_cold_3();
  }
  else {
    iVar64 = secp256k1_modinv64_mul_cmp_62(a_03,5,b_00,1);
    if (-1 < iVar64) goto LAB_00144119;
    uVar66 = lVar113 >> 0x3f;
    uVar67 = (long)psVar93 >> 0x3f;
    uVar73 = ((uVar66 & b_00->v[0]) + lVar119 ^ uVar67) - uVar67;
    uVar68 = ((long)uVar73 >> 0x3e) + (((uVar66 & b_00->v[1]) + lVar83 ^ uVar67) - uVar67);
    uVar110 = ((long)uVar68 >> 0x3e) + ((lVar84 + (uVar66 & b_00->v[2]) ^ uVar67) - uVar67);
    uVar69 = ((long)uVar110 >> 0x3e) + (((uVar66 & b_00->v[3]) + lVar85 ^ uVar67) - uVar67);
    lVar119 = ((long)uVar69 >> 0x3e) + (((uVar66 & b_00->v[4]) + lVar113 ^ uVar67) - uVar67);
    uVar67 = lVar119 >> 0x3f;
    uVar66 = (b_00->v[0] & uVar67) + (uVar73 & 0x3fffffffffffffff);
    uVar68 = ((long)uVar66 >> 0x3e) + (b_00->v[1] & uVar67) + (uVar68 & 0x3fffffffffffffff);
    uVar73 = ((long)uVar68 >> 0x3e) + (b_00->v[2] & uVar67) + (uVar110 & 0x3fffffffffffffff);
    uVar69 = ((long)uVar73 >> 0x3e) + (b_00->v[3] & uVar67) + (uVar69 & 0x3fffffffffffffff);
    uVar67 = (b_00->v[4] & uVar67) + lVar119 + ((long)uVar69 >> 0x3e);
    a_03->v[0] = uVar66 & 0x3fffffffffffffff;
    a_03->v[1] = uVar68 & 0x3fffffffffffffff;
    a_03->v[2] = uVar73 & 0x3fffffffffffffff;
    a_03->v[3] = uVar69 & 0x3fffffffffffffff;
    a_03->v[4] = uVar67;
    if (0x3fffffffffffffff < uVar67) goto LAB_0014411e;
    iVar64 = secp256k1_modinv64_mul_cmp_62(a_03,5,b_00,0);
    if (-1 < iVar64) {
      iVar64 = secp256k1_modinv64_mul_cmp_62(a_03,5,b_00,1);
      if (iVar64 < 0) {
        return;
      }
      goto LAB_00144128;
    }
  }
  secp256k1_modinv64_normalize_62_cold_2();
LAB_00144128:
  secp256k1_modinv64_normalize_62_cold_1();
  return;
}

Assistant:

static void secp256k1_scalar_mul(secp256k1_scalar *r, const secp256k1_scalar *a, const secp256k1_scalar *b) {
    uint64_t l[8];
    SECP256K1_SCALAR_VERIFY(a);
    SECP256K1_SCALAR_VERIFY(b);

    secp256k1_scalar_mul_512(l, a, b);
    secp256k1_scalar_reduce_512(r, l);

    SECP256K1_SCALAR_VERIFY(r);
}